

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  bool bVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ulong uVar31;
  bool bVar32;
  uint uVar33;
  LinearSpace3fa *pLVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  ulong uVar39;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar48 [16];
  undefined1 auVar73 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  float fVar101;
  undefined4 uVar102;
  vfloat4 a0_2;
  float fVar109;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  float t1;
  undefined1 auVar113 [16];
  vfloat4 b0;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar122;
  vfloat4 a0_3;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  __m128 a_1;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar159;
  undefined1 auVar158 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar162 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar171 [16];
  undefined1 auVar180 [32];
  __m128 a;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar199;
  float fVar201;
  float fVar203;
  undefined1 auVar190 [16];
  float fVar200;
  float fVar202;
  float fVar204;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar216;
  float fVar217;
  vfloat4 a0_1;
  float fVar218;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  vfloat4 a0;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_378 [16];
  RayQueryContext *local_368;
  LinearSpace3fa *local_360;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar27;
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar228 [32];
  
  PVar4 = prim[1];
  uVar39 = (ulong)(byte)PVar4;
  fVar206 = *(float *)(prim + uVar39 * 0x19 + 0x12);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar44 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar83._16_16_ = vinsertps_avx(auVar44,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar48 = vsubps_avx(auVar40,*(undefined1 (*) [16])(prim + uVar39 * 0x19 + 6));
  fVar122 = fVar206 * auVar48._0_4_;
  fVar101 = fVar206 * auVar83._16_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar39 * 4 + 6);
  auVar70 = vpmovsxbd_avx2(auVar40);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar39 * 5 + 6);
  auVar68 = vpmovsxbd_avx2(auVar44);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar39 * 6 + 6);
  auVar75 = vpmovsxbd_avx2(auVar3);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar39 * 0xb + 6);
  auVar86 = vpmovsxbd_avx2(auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar79 = vpmovsxbd_avx2(auVar50);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vcvtdq2ps_avx(auVar79);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar39 + 6);
  auVar69 = vpmovsxbd_avx2(auVar46);
  auVar69 = vcvtdq2ps_avx(auVar69);
  uVar31 = (ulong)(uint)((int)(uVar39 * 9) * 2);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar31 + 6);
  auVar76 = vpmovsxbd_avx2(auVar47);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar31 + uVar39 + 6);
  auVar77 = vpmovsxbd_avx2(auVar41);
  auVar77 = vcvtdq2ps_avx(auVar77);
  uVar26 = (ulong)(uint)((int)(uVar39 * 5) << 2);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar26 + 6);
  auVar67 = vpmovsxbd_avx2(auVar45);
  auVar78 = vcvtdq2ps_avx(auVar67);
  auVar223._4_4_ = fVar101;
  auVar223._0_4_ = fVar101;
  auVar223._8_4_ = fVar101;
  auVar223._12_4_ = fVar101;
  auVar223._16_4_ = fVar101;
  auVar223._20_4_ = fVar101;
  auVar223._24_4_ = fVar101;
  auVar223._28_4_ = fVar101;
  auVar235._8_4_ = 1;
  auVar235._0_8_ = 0x100000001;
  auVar235._12_4_ = 1;
  auVar235._16_4_ = 1;
  auVar235._20_4_ = 1;
  auVar235._24_4_ = 1;
  auVar235._28_4_ = 1;
  auVar65 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar243 = ZEXT3264(auVar65);
  auVar81 = ZEXT1632(CONCAT412(fVar206 * auVar83._28_4_,
                               CONCAT48(fVar206 * auVar83._24_4_,
                                        CONCAT44(fVar206 * auVar83._20_4_,fVar101))));
  auVar80 = vpermps_avx2(auVar235,auVar81);
  auVar66 = vpermps_avx512vl(auVar65,auVar81);
  fVar101 = auVar66._0_4_;
  fVar200 = auVar66._4_4_;
  auVar81._4_4_ = fVar200 * auVar75._4_4_;
  auVar81._0_4_ = fVar101 * auVar75._0_4_;
  fVar202 = auVar66._8_4_;
  auVar81._8_4_ = fVar202 * auVar75._8_4_;
  fVar109 = auVar66._12_4_;
  auVar81._12_4_ = fVar109 * auVar75._12_4_;
  fVar110 = auVar66._16_4_;
  auVar81._16_4_ = fVar110 * auVar75._16_4_;
  fVar111 = auVar66._20_4_;
  auVar81._20_4_ = fVar111 * auVar75._20_4_;
  fVar112 = auVar66._24_4_;
  auVar81._24_4_ = fVar112 * auVar75._24_4_;
  auVar81._28_4_ = auVar79._28_4_;
  auVar79._4_4_ = auVar69._4_4_ * fVar200;
  auVar79._0_4_ = auVar69._0_4_ * fVar101;
  auVar79._8_4_ = auVar69._8_4_ * fVar202;
  auVar79._12_4_ = auVar69._12_4_ * fVar109;
  auVar79._16_4_ = auVar69._16_4_ * fVar110;
  auVar79._20_4_ = auVar69._20_4_ * fVar111;
  auVar79._24_4_ = auVar69._24_4_ * fVar112;
  auVar79._28_4_ = auVar67._28_4_;
  auVar67._4_4_ = auVar78._4_4_ * fVar200;
  auVar67._0_4_ = auVar78._0_4_ * fVar101;
  auVar67._8_4_ = auVar78._8_4_ * fVar202;
  auVar67._12_4_ = auVar78._12_4_ * fVar109;
  auVar67._16_4_ = auVar78._16_4_ * fVar110;
  auVar67._20_4_ = auVar78._20_4_ * fVar111;
  auVar67._24_4_ = auVar78._24_4_ * fVar112;
  auVar67._28_4_ = auVar66._28_4_;
  auVar40 = vfmadd231ps_fma(auVar81,auVar80,auVar68);
  auVar44 = vfmadd231ps_fma(auVar79,auVar80,auVar87);
  auVar3 = vfmadd231ps_fma(auVar67,auVar77,auVar80);
  auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar223,auVar70);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar223,auVar86);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar76,auVar223);
  auVar224._4_4_ = fVar122;
  auVar224._0_4_ = fVar122;
  auVar224._8_4_ = fVar122;
  auVar224._12_4_ = fVar122;
  auVar224._16_4_ = fVar122;
  auVar224._20_4_ = fVar122;
  auVar224._24_4_ = fVar122;
  auVar224._28_4_ = fVar122;
  auVar67 = ZEXT1632(CONCAT412(fVar206 * auVar48._12_4_,
                               CONCAT48(fVar206 * auVar48._8_4_,
                                        CONCAT44(fVar206 * auVar48._4_4_,fVar122))));
  auVar79 = vpermps_avx2(auVar235,auVar67);
  auVar67 = vpermps_avx512vl(auVar65,auVar67);
  fVar206 = auVar67._0_4_;
  fVar101 = auVar67._4_4_;
  auVar80._4_4_ = fVar101 * auVar75._4_4_;
  auVar80._0_4_ = fVar206 * auVar75._0_4_;
  fVar200 = auVar67._8_4_;
  auVar80._8_4_ = fVar200 * auVar75._8_4_;
  fVar202 = auVar67._12_4_;
  auVar80._12_4_ = fVar202 * auVar75._12_4_;
  fVar109 = auVar67._16_4_;
  auVar80._16_4_ = fVar109 * auVar75._16_4_;
  fVar110 = auVar67._20_4_;
  auVar80._20_4_ = fVar110 * auVar75._20_4_;
  fVar111 = auVar67._24_4_;
  auVar80._24_4_ = fVar111 * auVar75._24_4_;
  auVar80._28_4_ = 1;
  auVar65._4_4_ = auVar69._4_4_ * fVar101;
  auVar65._0_4_ = auVar69._0_4_ * fVar206;
  auVar65._8_4_ = auVar69._8_4_ * fVar200;
  auVar65._12_4_ = auVar69._12_4_ * fVar202;
  auVar65._16_4_ = auVar69._16_4_ * fVar109;
  auVar65._20_4_ = auVar69._20_4_ * fVar110;
  auVar65._24_4_ = auVar69._24_4_ * fVar111;
  auVar65._28_4_ = auVar75._28_4_;
  auVar69._4_4_ = auVar78._4_4_ * fVar101;
  auVar69._0_4_ = auVar78._0_4_ * fVar206;
  auVar69._8_4_ = auVar78._8_4_ * fVar200;
  auVar69._12_4_ = auVar78._12_4_ * fVar202;
  auVar69._16_4_ = auVar78._16_4_ * fVar109;
  auVar69._20_4_ = auVar78._20_4_ * fVar110;
  auVar69._24_4_ = auVar78._24_4_ * fVar111;
  auVar69._28_4_ = auVar67._28_4_;
  auVar49 = vfmadd231ps_fma(auVar80,auVar79,auVar68);
  auVar50 = vfmadd231ps_fma(auVar65,auVar79,auVar87);
  auVar46 = vfmadd231ps_fma(auVar69,auVar79,auVar77);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar224,auVar70);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar224,auVar86);
  auVar89._8_4_ = 0x7fffffff;
  auVar89._0_8_ = 0x7fffffff7fffffff;
  auVar89._12_4_ = 0x7fffffff;
  auVar89._16_4_ = 0x7fffffff;
  auVar89._20_4_ = 0x7fffffff;
  auVar89._24_4_ = 0x7fffffff;
  auVar89._28_4_ = 0x7fffffff;
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar224,auVar76);
  auVar70 = vandps_avx(ZEXT1632(auVar40),auVar89);
  auVar145._8_4_ = 0x219392ef;
  auVar145._0_8_ = 0x219392ef219392ef;
  auVar145._12_4_ = 0x219392ef;
  auVar145._16_4_ = 0x219392ef;
  auVar145._20_4_ = 0x219392ef;
  auVar145._24_4_ = 0x219392ef;
  auVar145._28_4_ = 0x219392ef;
  uVar31 = vcmpps_avx512vl(auVar70,auVar145,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar66._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar40._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar40._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar40._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar40._12_4_;
  auVar66._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar66._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar66._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar66._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar70 = vandps_avx(ZEXT1632(auVar44),auVar89);
  uVar31 = vcmpps_avx512vl(auVar70,auVar145,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar82._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar44._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar44._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar44._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar44._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar70 = vandps_avx(ZEXT1632(auVar3),auVar89);
  uVar31 = vcmpps_avx512vl(auVar70,auVar145,1);
  bVar32 = (bool)((byte)uVar31 & 1);
  auVar70._0_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar3._0_4_;
  bVar32 = (bool)((byte)(uVar31 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar3._4_4_;
  bVar32 = (bool)((byte)(uVar31 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar3._8_4_;
  bVar32 = (bool)((byte)(uVar31 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar32 * 0x219392ef | (uint)!bVar32 * auVar3._12_4_;
  auVar70._16_4_ = (uint)((byte)(uVar31 >> 4) & 1) * 0x219392ef;
  auVar70._20_4_ = (uint)((byte)(uVar31 >> 5) & 1) * 0x219392ef;
  auVar70._24_4_ = (uint)((byte)(uVar31 >> 6) & 1) * 0x219392ef;
  auVar70._28_4_ = (uint)(byte)(uVar31 >> 7) * 0x219392ef;
  auVar68 = vrcp14ps_avx512vl(auVar66);
  auVar133._8_4_ = 0x3f800000;
  auVar133._0_8_ = 0x3f8000003f800000;
  auVar133._12_4_ = 0x3f800000;
  auVar133._16_4_ = 0x3f800000;
  auVar133._20_4_ = 0x3f800000;
  auVar133._24_4_ = 0x3f800000;
  auVar133._28_4_ = 0x3f800000;
  auVar40 = vfnmadd213ps_fma(auVar66,auVar68,auVar133);
  auVar40 = vfmadd132ps_fma(ZEXT1632(auVar40),auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar82);
  auVar44 = vfnmadd213ps_fma(auVar82,auVar68,auVar133);
  auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar70);
  auVar3 = vfnmadd213ps_fma(auVar70,auVar68,auVar133);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar68,auVar68);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar39 * 7 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar49));
  auVar76._4_4_ = auVar40._4_4_ * auVar70._4_4_;
  auVar76._0_4_ = auVar40._0_4_ * auVar70._0_4_;
  auVar76._8_4_ = auVar40._8_4_ * auVar70._8_4_;
  auVar76._12_4_ = auVar40._12_4_ * auVar70._12_4_;
  auVar76._16_4_ = auVar70._16_4_ * 0.0;
  auVar76._20_4_ = auVar70._20_4_ * 0.0;
  auVar76._24_4_ = auVar70._24_4_ * 0.0;
  auVar76._28_4_ = auVar70._28_4_;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar39 * 9 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar49));
  auVar69 = vpbroadcastd_avx512vl();
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar88._0_4_ = auVar40._0_4_ * auVar70._0_4_;
  auVar88._4_4_ = auVar40._4_4_ * auVar70._4_4_;
  auVar88._8_4_ = auVar40._8_4_ * auVar70._8_4_;
  auVar88._12_4_ = auVar40._12_4_ * auVar70._12_4_;
  auVar88._16_4_ = auVar70._16_4_ * 0.0;
  auVar88._20_4_ = auVar70._20_4_ * 0.0;
  auVar88._24_4_ = auVar70._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar39 * -2 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar50));
  auVar77._4_4_ = auVar44._4_4_ * auVar70._4_4_;
  auVar77._0_4_ = auVar44._0_4_ * auVar70._0_4_;
  auVar77._8_4_ = auVar44._8_4_ * auVar70._8_4_;
  auVar77._12_4_ = auVar44._12_4_ * auVar70._12_4_;
  auVar77._16_4_ = auVar70._16_4_ * 0.0;
  auVar77._20_4_ = auVar70._20_4_ * 0.0;
  auVar77._24_4_ = auVar70._24_4_ * 0.0;
  auVar77._28_4_ = auVar70._28_4_;
  auVar70 = vcvtdq2ps_avx(auVar68);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar50));
  auVar85._0_4_ = auVar44._0_4_ * auVar70._0_4_;
  auVar85._4_4_ = auVar44._4_4_ * auVar70._4_4_;
  auVar85._8_4_ = auVar44._8_4_ * auVar70._8_4_;
  auVar85._12_4_ = auVar44._12_4_ * auVar70._12_4_;
  auVar85._16_4_ = auVar70._16_4_ * 0.0;
  auVar85._20_4_ = auVar70._20_4_ * 0.0;
  auVar85._24_4_ = auVar70._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 + uVar39 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar46));
  auVar78._4_4_ = auVar70._4_4_ * auVar3._4_4_;
  auVar78._0_4_ = auVar70._0_4_ * auVar3._0_4_;
  auVar78._8_4_ = auVar70._8_4_ * auVar3._8_4_;
  auVar78._12_4_ = auVar70._12_4_ * auVar3._12_4_;
  auVar78._16_4_ = auVar70._16_4_ * 0.0;
  auVar78._20_4_ = auVar70._20_4_ * 0.0;
  auVar78._24_4_ = auVar70._24_4_ * 0.0;
  auVar78._28_4_ = auVar70._28_4_;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar39 * 0x17 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar70 = vsubps_avx(auVar70,ZEXT1632(auVar46));
  auVar84._0_4_ = auVar3._0_4_ * auVar70._0_4_;
  auVar84._4_4_ = auVar3._4_4_ * auVar70._4_4_;
  auVar84._8_4_ = auVar3._8_4_ * auVar70._8_4_;
  auVar84._12_4_ = auVar3._12_4_ * auVar70._12_4_;
  auVar84._16_4_ = auVar70._16_4_ * 0.0;
  auVar84._20_4_ = auVar70._20_4_ * 0.0;
  auVar84._24_4_ = auVar70._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar70 = vpminsd_avx2(auVar76,auVar88);
  auVar68 = vpminsd_avx2(auVar77,auVar85);
  auVar70 = vmaxps_avx(auVar70,auVar68);
  auVar68 = vpminsd_avx2(auVar78,auVar84);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar75._4_4_ = uVar102;
  auVar75._0_4_ = uVar102;
  auVar75._8_4_ = uVar102;
  auVar75._12_4_ = uVar102;
  auVar75._16_4_ = uVar102;
  auVar75._20_4_ = uVar102;
  auVar75._24_4_ = uVar102;
  auVar75._28_4_ = uVar102;
  auVar68 = vmaxps_avx512vl(auVar68,auVar75);
  auVar70 = vmaxps_avx(auVar70,auVar68);
  auVar68._8_4_ = 0x3f7ffffa;
  auVar68._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar68._12_4_ = 0x3f7ffffa;
  auVar68._16_4_ = 0x3f7ffffa;
  auVar68._20_4_ = 0x3f7ffffa;
  auVar68._24_4_ = 0x3f7ffffa;
  auVar68._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar70,auVar68);
  auVar70 = vpmaxsd_avx2(auVar76,auVar88);
  auVar68 = vpmaxsd_avx2(auVar77,auVar85);
  auVar70 = vminps_avx(auVar70,auVar68);
  auVar68 = vpmaxsd_avx2(auVar78,auVar84);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar86._4_4_ = uVar102;
  auVar86._0_4_ = uVar102;
  auVar86._8_4_ = uVar102;
  auVar86._12_4_ = uVar102;
  auVar86._16_4_ = uVar102;
  auVar86._20_4_ = uVar102;
  auVar86._24_4_ = uVar102;
  auVar86._28_4_ = uVar102;
  auVar68 = vminps_avx512vl(auVar68,auVar86);
  auVar70 = vminps_avx(auVar70,auVar68);
  auVar87._8_4_ = 0x3f800003;
  auVar87._0_8_ = 0x3f8000033f800003;
  auVar87._12_4_ = 0x3f800003;
  auVar87._16_4_ = 0x3f800003;
  auVar87._20_4_ = 0x3f800003;
  auVar87._24_4_ = 0x3f800003;
  auVar87._28_4_ = 0x3f800003;
  auVar70 = vmulps_avx512vl(auVar70,auVar87);
  uVar12 = vpcmpgtd_avx512vl(auVar69,_DAT_01fe9900);
  uVar11 = vcmpps_avx512vl(local_78,auVar70,2);
  if ((byte)((byte)uVar11 & (byte)uVar12) == 0) {
    return false;
  }
  uVar31 = (ulong)(byte)((byte)uVar11 & (byte)uVar12);
  pLVar34 = pre->ray_space + k;
  local_2f8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar83._16_16_ = auVar70._16_16_;
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar236 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar238 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar239 = ZEXT1664(auVar40);
  auVar245 = ZEXT464(0x3f800000);
  auVar40 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar244 = ZEXT1664(auVar40);
  local_360 = pLVar34;
LAB_01cff1a0:
  lVar28 = 0;
  for (uVar26 = uVar31; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar28 = lVar28 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(prim + lVar28 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar40 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar26);
  lVar28 = uVar26 + 1;
  auVar44 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar28);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar3 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar26);
  auVar49 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar28);
  local_298 = vpbroadcastd_avx512vl();
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar229._8_4_ = 0x3eaaaaab;
  auVar229._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar229._12_4_ = 0x3eaaaaab;
  auVar46 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar7[2].intersectionFilterN +
                             (long)pGVar7[2].pointQueryFunc * uVar26),auVar40,auVar229);
  auVar45 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar7[2].intersectionFilterN +
                              (long)pGVar7[2].pointQueryFunc * lVar28),auVar44,auVar229);
  auVar47 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar7[3].userPtr +
                             uVar26 * *(long *)&pGVar7[3].fnumTimeSegments),auVar3,auVar229);
  auVar48 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar7[3].userPtr +
                              *(long *)&pGVar7[3].fnumTimeSegments * lVar28),auVar49,auVar229);
  auVar72._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
  auVar41 = vmulps_avx512vl(auVar44,auVar72._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar41,auVar45,auVar72._0_16_);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar46,auVar42);
  auVar160._0_4_ = auVar41._0_4_ + auVar40._0_4_;
  auVar160._4_4_ = auVar41._4_4_ + auVar40._4_4_;
  auVar160._8_4_ = auVar41._8_4_ + auVar40._8_4_;
  auVar160._12_4_ = auVar41._12_4_ + auVar40._12_4_;
  auVar103 = auVar236._0_16_;
  auVar41 = vfmadd231ps_avx512vl(auVar42,auVar46,auVar103);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar40,auVar103);
  auVar41 = vmulps_avx512vl(auVar49,auVar72._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar72._0_16_);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar43);
  auVar219._0_4_ = auVar41._0_4_ + auVar3._0_4_;
  auVar219._4_4_ = auVar41._4_4_ + auVar3._4_4_;
  auVar219._8_4_ = auVar41._8_4_ + auVar3._8_4_;
  auVar219._12_4_ = auVar41._12_4_ + auVar3._12_4_;
  auVar41 = vfmadd231ps_avx512vl(auVar43,auVar47,auVar103);
  auVar43 = vfnmadd231ps_avx512vl(auVar41,auVar3,auVar103);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar45,auVar44);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar46,auVar72._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar40,auVar72._0_16_);
  auVar44 = vmulps_avx512vl(auVar44,auVar103);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar103,auVar45);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar72._0_16_,auVar46);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar72._0_16_,auVar40);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar49);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar47,auVar72._0_16_);
  auVar46 = vfmadd231ps_avx512vl(auVar40,auVar3,auVar72._0_16_);
  auVar40 = vmulps_avx512vl(auVar49,auVar103);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar103,auVar48);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar72._0_16_,auVar47);
  auVar47 = vfnmadd231ps_avx512vl(auVar40,auVar72._0_16_,auVar3);
  auVar40 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar44 = vshufps_avx(auVar219,auVar219,0xc9);
  fVar122 = auVar42._0_4_;
  auVar63._0_4_ = fVar122 * auVar44._0_4_;
  fVar159 = auVar42._4_4_;
  auVar63._4_4_ = fVar159 * auVar44._4_4_;
  fVar204 = auVar42._8_4_;
  auVar63._8_4_ = fVar204 * auVar44._8_4_;
  fVar205 = auVar42._12_4_;
  auVar63._12_4_ = fVar205 * auVar44._12_4_;
  auVar44 = vfmsub231ps_fma(auVar63,auVar40,auVar219);
  auVar3 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar135._0_4_ = fVar122 * auVar44._0_4_;
  auVar135._4_4_ = fVar159 * auVar44._4_4_;
  auVar135._8_4_ = fVar204 * auVar44._8_4_;
  auVar135._12_4_ = fVar205 * auVar44._12_4_;
  auVar40 = vfmsub231ps_fma(auVar135,auVar40,auVar43);
  auVar49 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar44 = vshufps_avx(auVar46,auVar46,0xc9);
  fVar206 = auVar45._0_4_;
  auVar181._0_4_ = auVar44._0_4_ * fVar206;
  fVar101 = auVar45._4_4_;
  auVar181._4_4_ = auVar44._4_4_ * fVar101;
  fVar200 = auVar45._8_4_;
  auVar181._8_4_ = auVar44._8_4_ * fVar200;
  fVar202 = auVar45._12_4_;
  auVar181._12_4_ = auVar44._12_4_ * fVar202;
  auVar44 = vfmsub231ps_fma(auVar181,auVar40,auVar46);
  auVar46 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar44 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar182._0_4_ = auVar44._0_4_ * fVar206;
  auVar182._4_4_ = auVar44._4_4_ * fVar101;
  auVar182._8_4_ = auVar44._8_4_ * fVar200;
  auVar182._12_4_ = auVar44._12_4_ * fVar202;
  auVar40 = vfmsub231ps_fma(auVar182,auVar40,auVar47);
  auVar47 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar109 = auVar40._0_4_;
  auVar72._16_16_ = auVar83._16_16_;
  auVar71._4_28_ = auVar72._4_28_;
  auVar71._0_4_ = fVar109;
  auVar44 = vrsqrt14ss_avx512f(auVar72._0_16_,auVar71._0_16_);
  auVar48 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  fVar110 = auVar44._0_4_;
  fVar111 = auVar48._0_4_ - auVar43._0_4_ * fVar110 * fVar110 * fVar110;
  fVar207 = fVar111 * auVar3._0_4_;
  fVar216 = fVar111 * auVar3._4_4_;
  fVar217 = fVar111 * auVar3._8_4_;
  fVar218 = fVar111 * auVar3._12_4_;
  auVar44 = vdpps_avx(auVar3,auVar49,0x7f);
  auVar136._0_4_ = fVar109 * auVar49._0_4_;
  auVar136._4_4_ = fVar109 * auVar49._4_4_;
  auVar136._8_4_ = fVar109 * auVar49._8_4_;
  auVar136._12_4_ = fVar109 * auVar49._12_4_;
  fVar109 = auVar44._0_4_;
  auVar129._0_4_ = fVar109 * auVar3._0_4_;
  auVar129._4_4_ = fVar109 * auVar3._4_4_;
  auVar129._8_4_ = fVar109 * auVar3._8_4_;
  auVar129._12_4_ = fVar109 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar136,auVar129);
  auVar44 = vrcp14ss_avx512f(auVar72._0_16_,auVar71._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar44,ZEXT416(0x40000000));
  fVar109 = auVar44._0_4_ * auVar40._0_4_;
  auVar40 = vdpps_avx(auVar46,auVar46,0x7f);
  fVar110 = auVar40._0_4_;
  auVar74._16_16_ = auVar83._16_16_;
  auVar74._0_16_ = auVar72._0_16_;
  auVar73._4_28_ = auVar74._4_28_;
  auVar73._0_4_ = fVar110;
  auVar44 = vrsqrt14ss_avx512f(auVar72._0_16_,auVar73._0_16_);
  auVar49 = vmulss_avx512f(auVar44,ZEXT416(0x3fc00000));
  auVar83._16_16_ = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
  fVar112 = auVar44._0_4_;
  fVar112 = auVar49._0_4_ - auVar83._16_4_ * fVar112 * fVar112 * fVar112;
  fVar189 = fVar112 * auVar46._0_4_;
  fVar199 = fVar112 * auVar46._4_4_;
  fVar201 = fVar112 * auVar46._8_4_;
  fVar203 = fVar112 * auVar46._12_4_;
  auVar44 = vdpps_avx(auVar46,auVar47,0x7f);
  auVar55._0_4_ = fVar110 * auVar47._0_4_;
  auVar55._4_4_ = fVar110 * auVar47._4_4_;
  auVar55._8_4_ = fVar110 * auVar47._8_4_;
  auVar55._12_4_ = fVar110 * auVar47._12_4_;
  fVar110 = auVar44._0_4_;
  auVar43._0_4_ = fVar110 * auVar46._0_4_;
  auVar43._4_4_ = fVar110 * auVar46._4_4_;
  auVar43._8_4_ = fVar110 * auVar46._8_4_;
  auVar43._12_4_ = fVar110 * auVar46._12_4_;
  auVar49 = vsubps_avx(auVar55,auVar43);
  auVar44 = vrcp14ss_avx512f(auVar72._0_16_,auVar73._0_16_);
  auVar40 = vfnmadd213ss_avx512f(auVar40,auVar44,ZEXT416(0x40000000));
  fVar110 = auVar44._0_4_ * auVar40._0_4_;
  auVar40 = vshufps_avx(auVar160,auVar160,0xff);
  auVar130._0_4_ = fVar207 * auVar40._0_4_;
  auVar130._4_4_ = fVar216 * auVar40._4_4_;
  auVar130._8_4_ = fVar217 * auVar40._8_4_;
  auVar130._12_4_ = fVar218 * auVar40._12_4_;
  local_218 = vsubps_avx(auVar160,auVar130);
  auVar44 = vshufps_avx(auVar42,auVar42,0xff);
  auVar56._0_4_ = fVar207 * auVar44._0_4_ + auVar40._0_4_ * fVar111 * auVar3._0_4_ * fVar109;
  auVar56._4_4_ = fVar216 * auVar44._4_4_ + auVar40._4_4_ * fVar111 * auVar3._4_4_ * fVar109;
  auVar56._8_4_ = fVar217 * auVar44._8_4_ + auVar40._8_4_ * fVar111 * auVar3._8_4_ * fVar109;
  auVar56._12_4_ = fVar218 * auVar44._12_4_ + auVar40._12_4_ * fVar111 * auVar3._12_4_ * fVar109;
  auVar3 = vsubps_avx(auVar42,auVar56);
  local_228._0_4_ = auVar160._0_4_ + auVar130._0_4_;
  local_228._4_4_ = auVar160._4_4_ + auVar130._4_4_;
  fStack_220 = auVar160._8_4_ + auVar130._8_4_;
  fStack_21c = auVar160._12_4_ + auVar130._12_4_;
  auVar40 = vshufps_avx(auVar41,auVar41,0xff);
  auVar137._0_4_ = fVar189 * auVar40._0_4_;
  auVar137._4_4_ = fVar199 * auVar40._4_4_;
  auVar137._8_4_ = fVar201 * auVar40._8_4_;
  auVar137._12_4_ = fVar203 * auVar40._12_4_;
  local_238 = vsubps_avx512vl(auVar41,auVar137);
  auVar44 = vshufps_avx(auVar45,auVar45,0xff);
  auVar42._0_4_ = fVar189 * auVar44._0_4_ + auVar40._0_4_ * fVar112 * auVar49._0_4_ * fVar110;
  auVar42._4_4_ = fVar199 * auVar44._4_4_ + auVar40._4_4_ * fVar112 * auVar49._4_4_ * fVar110;
  auVar42._8_4_ = fVar201 * auVar44._8_4_ + auVar40._8_4_ * fVar112 * auVar49._8_4_ * fVar110;
  auVar42._12_4_ = fVar203 * auVar44._12_4_ + auVar40._12_4_ * fVar112 * auVar49._12_4_ * fVar110;
  auVar40 = vsubps_avx(auVar45,auVar42);
  _local_248 = vaddps_avx512vl(auVar41,auVar137);
  auVar51._0_4_ = auVar3._0_4_ * 0.33333334;
  auVar51._4_4_ = auVar3._4_4_ * 0.33333334;
  auVar51._8_4_ = auVar3._8_4_ * 0.33333334;
  auVar51._12_4_ = auVar3._12_4_ * 0.33333334;
  local_258 = vaddps_avx512vl(local_218,auVar51);
  auVar52._0_4_ = auVar40._0_4_ * 0.33333334;
  auVar52._4_4_ = auVar40._4_4_ * 0.33333334;
  auVar52._8_4_ = auVar40._8_4_ * 0.33333334;
  auVar52._12_4_ = auVar40._12_4_ * 0.33333334;
  local_268 = vsubps_avx512vl(local_238,auVar52);
  auVar57._0_4_ = (fVar122 + auVar56._0_4_) * 0.33333334;
  auVar57._4_4_ = (fVar159 + auVar56._4_4_) * 0.33333334;
  auVar57._8_4_ = (fVar204 + auVar56._8_4_) * 0.33333334;
  auVar57._12_4_ = (fVar205 + auVar56._12_4_) * 0.33333334;
  _local_278 = vaddps_avx512vl(_local_228,auVar57);
  auVar103._0_4_ = (fVar206 + auVar42._0_4_) * 0.33333334;
  auVar103._4_4_ = (fVar101 + auVar42._4_4_) * 0.33333334;
  auVar103._8_4_ = (fVar200 + auVar42._8_4_) * 0.33333334;
  auVar103._12_4_ = (fVar202 + auVar42._12_4_) * 0.33333334;
  _local_288 = vsubps_avx512vl(_local_248,auVar103);
  local_198 = vsubps_avx(local_218,auVar50);
  uVar102 = local_198._0_4_;
  auVar61._4_4_ = uVar102;
  auVar61._0_4_ = uVar102;
  auVar61._8_4_ = uVar102;
  auVar61._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_198,local_198,0x55);
  auVar44 = vshufps_avx(local_198,local_198,0xaa);
  aVar1 = (pLVar34->vx).field_0;
  aVar2 = (pLVar34->vy).field_0;
  fVar206 = (pLVar34->vz).field_0.m128[0];
  fVar101 = *(float *)((long)&(pLVar34->vz).field_0 + 4);
  fVar200 = *(float *)((long)&(pLVar34->vz).field_0 + 8);
  fVar202 = *(float *)((long)&(pLVar34->vz).field_0 + 0xc);
  auVar104._0_4_ = fVar206 * auVar44._0_4_;
  auVar104._4_4_ = fVar101 * auVar44._4_4_;
  auVar104._8_4_ = fVar200 * auVar44._8_4_;
  auVar104._12_4_ = fVar202 * auVar44._12_4_;
  auVar40 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar2,auVar40);
  auVar47 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar61);
  local_1a8 = vsubps_avx512vl(local_258,auVar50);
  uVar102 = local_1a8._0_4_;
  auVar60._4_4_ = uVar102;
  auVar60._0_4_ = uVar102;
  auVar60._8_4_ = uVar102;
  auVar60._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar44 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar64._0_4_ = fVar206 * auVar44._0_4_;
  auVar64._4_4_ = fVar101 * auVar44._4_4_;
  auVar64._8_4_ = fVar200 * auVar44._8_4_;
  auVar64._12_4_ = fVar202 * auVar44._12_4_;
  auVar40 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar40);
  auVar41 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar60);
  local_1b8 = vsubps_avx512vl(local_268,auVar50);
  uVar102 = local_1b8._0_4_;
  auVar58._4_4_ = uVar102;
  auVar58._0_4_ = uVar102;
  auVar58._8_4_ = uVar102;
  auVar58._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar44 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar161._0_4_ = auVar44._0_4_ * fVar206;
  auVar161._4_4_ = auVar44._4_4_ * fVar101;
  auVar161._8_4_ = auVar44._8_4_ * fVar200;
  auVar161._12_4_ = auVar44._12_4_ * fVar202;
  auVar40 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar2,auVar40);
  auVar45 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar58);
  local_1c8 = vsubps_avx512vl(local_238,auVar50);
  uVar102 = local_1c8._0_4_;
  auVar59._4_4_ = uVar102;
  auVar59._0_4_ = uVar102;
  auVar59._8_4_ = uVar102;
  auVar59._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar44 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar170._0_4_ = auVar44._0_4_ * fVar206;
  auVar170._4_4_ = auVar44._4_4_ * fVar101;
  auVar170._8_4_ = auVar44._8_4_ * fVar200;
  auVar170._12_4_ = auVar44._12_4_ * fVar202;
  auVar40 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar2,auVar40);
  auVar83._16_16_ = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar59);
  local_1d8 = vsubps_avx(_local_228,auVar50);
  uVar102 = local_1d8._0_4_;
  auVar114._4_4_ = uVar102;
  auVar114._0_4_ = uVar102;
  auVar114._8_4_ = uVar102;
  auVar114._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar44 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar183._0_4_ = auVar44._0_4_ * fVar206;
  auVar183._4_4_ = auVar44._4_4_ * fVar101;
  auVar183._8_4_ = auVar44._8_4_ * fVar200;
  auVar183._12_4_ = auVar44._12_4_ * fVar202;
  auVar40 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar2,auVar40);
  auVar42 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar114);
  local_1e8 = vsubps_avx512vl(_local_278,auVar50);
  uVar102 = local_1e8._0_4_;
  auVar53._4_4_ = uVar102;
  auVar53._0_4_ = uVar102;
  auVar53._8_4_ = uVar102;
  auVar53._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar44 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar190._0_4_ = auVar44._0_4_ * fVar206;
  auVar190._4_4_ = auVar44._4_4_ * fVar101;
  auVar190._8_4_ = auVar44._8_4_ * fVar200;
  auVar190._12_4_ = auVar44._12_4_ * fVar202;
  auVar40 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar2,auVar40);
  auVar43 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar53);
  local_1f8 = vsubps_avx(_local_288,auVar50);
  uVar102 = local_1f8._0_4_;
  auVar54._4_4_ = uVar102;
  auVar54._0_4_ = uVar102;
  auVar54._8_4_ = uVar102;
  auVar54._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar44 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar208._0_4_ = auVar44._0_4_ * fVar206;
  auVar208._4_4_ = auVar44._4_4_ * fVar101;
  auVar208._8_4_ = auVar44._8_4_ * fVar200;
  auVar208._12_4_ = auVar44._12_4_ * fVar202;
  auVar40 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar2,auVar40);
  auVar103 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar54);
  local_208 = vsubps_avx512vl(_local_248,auVar50);
  uVar102 = local_208._0_4_;
  auVar62._4_4_ = uVar102;
  auVar62._0_4_ = uVar102;
  auVar62._8_4_ = uVar102;
  auVar62._12_4_ = uVar102;
  auVar40 = vshufps_avx(local_208,local_208,0x55);
  auVar44 = vshufps_avx(local_208,local_208,0xaa);
  auVar138._0_4_ = fVar206 * auVar44._0_4_;
  auVar138._4_4_ = fVar101 * auVar44._4_4_;
  auVar138._8_4_ = fVar200 * auVar44._8_4_;
  auVar138._12_4_ = fVar202 * auVar44._12_4_;
  auVar40 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar2,auVar40);
  auVar104 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar62);
  auVar3 = vmovlhps_avx(auVar47,auVar42);
  auVar49 = vmovlhps_avx(auVar41,auVar43);
  auVar46 = vmovlhps_avx512f(auVar45,auVar103);
  _local_348 = vmovlhps_avx512f(auVar83._16_16_,auVar104);
  auVar44 = vminps_avx(auVar3,auVar49);
  auVar40 = vmaxps_avx(auVar3,auVar49);
  auVar50 = vminps_avx512vl(auVar46,_local_348);
  auVar44 = vminps_avx(auVar44,auVar50);
  auVar50 = vmaxps_avx512vl(auVar46,_local_348);
  auVar40 = vmaxps_avx(auVar40,auVar50);
  auVar50 = vshufpd_avx(auVar44,auVar44,3);
  auVar44 = vminps_avx(auVar44,auVar50);
  auVar50 = vshufpd_avx(auVar40,auVar40,3);
  auVar40 = vmaxps_avx(auVar40,auVar50);
  auVar44 = vandps_avx512vl(auVar44,auVar238._0_16_);
  auVar40 = vandps_avx512vl(auVar40,auVar238._0_16_);
  auVar40 = vmaxps_avx(auVar44,auVar40);
  auVar44 = vmovshdup_avx(auVar40);
  auVar40 = vmaxss_avx(auVar44,auVar40);
  auVar50 = vmovddup_avx512vl(auVar47);
  auVar47 = vmovddup_avx512vl(auVar41);
  auVar162._0_8_ = auVar45._0_8_;
  auVar162._8_8_ = auVar162._0_8_;
  auVar171._0_8_ = auVar83._16_8_;
  auVar171._8_8_ = auVar171._0_8_;
  local_358 = ZEXT416((uint)(auVar40._0_4_ * 9.536743e-07));
  local_148 = vbroadcastss_avx512vl(local_358);
  auVar40 = vxorps_avx512vl(local_148._0_16_,auVar239._0_16_);
  local_168 = vbroadcastss_avx512vl(auVar40);
  bVar32 = false;
  uVar26 = 0;
  uVar33 = *(uint *)(ray + k * 4 + 0x30);
  auVar40 = vsubps_avx(auVar49,auVar3);
  local_178 = vsubps_avx512vl(auVar46,auVar49);
  local_188 = vsubps_avx512vl(_local_348,auVar46);
  local_2a8 = vsubps_avx(_local_228,local_218);
  local_2b8 = vsubps_avx512vl(_local_278,local_258);
  local_2c8 = vsubps_avx512vl(_local_288,local_268);
  _local_2d8 = vsubps_avx512vl(_local_248,local_238);
  local_2e8 = vpbroadcastd_avx512vl();
  auVar44 = ZEXT816(0x3f80000000000000);
  auVar48 = auVar44;
LAB_01cff894:
  do {
    auVar41 = vshufps_avx(auVar48,auVar48,0x50);
    auVar225._8_4_ = 0x3f800000;
    auVar225._0_8_ = 0x3f8000003f800000;
    auVar225._12_4_ = 0x3f800000;
    auVar228._16_4_ = 0x3f800000;
    auVar228._0_16_ = auVar225;
    auVar228._20_4_ = 0x3f800000;
    auVar228._24_4_ = 0x3f800000;
    auVar228._28_4_ = 0x3f800000;
    auVar45 = vsubps_avx(auVar225,auVar41);
    fVar206 = auVar41._0_4_;
    fVar109 = auVar42._0_4_;
    auVar131._0_4_ = fVar109 * fVar206;
    fVar101 = auVar41._4_4_;
    fVar110 = auVar42._4_4_;
    auVar131._4_4_ = fVar110 * fVar101;
    fVar200 = auVar41._8_4_;
    auVar131._8_4_ = fVar109 * fVar200;
    fVar202 = auVar41._12_4_;
    auVar131._12_4_ = fVar110 * fVar202;
    fVar111 = auVar43._0_4_;
    auVar139._0_4_ = fVar111 * fVar206;
    fVar112 = auVar43._4_4_;
    auVar139._4_4_ = fVar112 * fVar101;
    auVar139._8_4_ = fVar111 * fVar200;
    auVar139._12_4_ = fVar112 * fVar202;
    fVar122 = auVar103._0_4_;
    auVar148._0_4_ = fVar122 * fVar206;
    fVar159 = auVar103._4_4_;
    auVar148._4_4_ = fVar159 * fVar101;
    auVar148._8_4_ = fVar122 * fVar200;
    auVar148._12_4_ = fVar159 * fVar202;
    fVar199 = auVar104._0_4_;
    auVar115._0_4_ = fVar199 * fVar206;
    fVar201 = auVar104._4_4_;
    auVar115._4_4_ = fVar201 * fVar101;
    auVar115._8_4_ = fVar199 * fVar200;
    auVar115._12_4_ = fVar201 * fVar202;
    auVar51 = vfmadd231ps_avx512vl(auVar131,auVar45,auVar50);
    auVar52 = vfmadd231ps_avx512vl(auVar139,auVar45,auVar47);
    auVar83._16_16_ = vfmadd231ps_fma(auVar148,auVar45,auVar162);
    auVar45 = vfmadd231ps_fma(auVar115,auVar171,auVar45);
    auVar41 = vmovshdup_avx(auVar44);
    fVar101 = auVar44._0_4_;
    fVar206 = (auVar41._0_4_ - fVar101) * 0.04761905;
    auVar169._4_4_ = fVar101;
    auVar169._0_4_ = fVar101;
    auVar169._8_4_ = fVar101;
    auVar169._12_4_ = fVar101;
    auVar169._16_4_ = fVar101;
    auVar169._20_4_ = fVar101;
    auVar169._24_4_ = fVar101;
    auVar169._28_4_ = fVar101;
    auVar127._0_8_ = auVar41._0_8_;
    auVar127._8_8_ = auVar127._0_8_;
    auVar127._16_8_ = auVar127._0_8_;
    auVar127._24_8_ = auVar127._0_8_;
    auVar70 = vsubps_avx(auVar127,auVar169);
    uVar102 = auVar51._0_4_;
    auVar128._4_4_ = uVar102;
    auVar128._0_4_ = uVar102;
    auVar128._8_4_ = uVar102;
    auVar128._12_4_ = uVar102;
    auVar128._16_4_ = uVar102;
    auVar128._20_4_ = uVar102;
    auVar128._24_4_ = uVar102;
    auVar128._28_4_ = uVar102;
    auVar186._8_4_ = 1;
    auVar186._0_8_ = 0x100000001;
    auVar186._12_4_ = 1;
    auVar186._16_4_ = 1;
    auVar186._20_4_ = 1;
    auVar186._24_4_ = 1;
    auVar186._28_4_ = 1;
    auVar86 = ZEXT1632(auVar51);
    auVar68 = vpermps_avx2(auVar186,auVar86);
    auVar75 = vbroadcastss_avx512vl(auVar52);
    auVar87 = ZEXT1632(auVar52);
    auVar69 = vpermps_avx512vl(auVar186,auVar87);
    auVar76 = vbroadcastss_avx512vl(auVar83._16_16_);
    auVar66 = ZEXT1632(auVar83._16_16_);
    auVar77 = vpermps_avx512vl(auVar186,auVar66);
    auVar78 = vbroadcastss_avx512vl(auVar45);
    auVar82 = ZEXT1632(auVar45);
    auVar79 = vpermps_avx512vl(auVar186,auVar82);
    auVar187._4_4_ = fVar206;
    auVar187._0_4_ = fVar206;
    auVar187._8_4_ = fVar206;
    auVar187._12_4_ = fVar206;
    auVar187._16_4_ = fVar206;
    auVar187._20_4_ = fVar206;
    auVar187._24_4_ = fVar206;
    auVar187._28_4_ = fVar206;
    auVar83 = auVar243._0_32_;
    auVar67 = vpermps_avx512vl(auVar83,auVar86);
    auVar158._8_4_ = 3;
    auVar158._0_8_ = 0x300000003;
    auVar158._12_4_ = 3;
    auVar158._16_4_ = 3;
    auVar158._20_4_ = 3;
    auVar158._24_4_ = 3;
    auVar158._28_4_ = 3;
    auVar80 = vpermps_avx512vl(auVar158,auVar86);
    auVar81 = vpermps_avx512vl(auVar83,auVar87);
    auVar86 = vpermps_avx2(auVar158,auVar87);
    auVar65 = vpermps_avx512vl(auVar83,auVar66);
    auVar87 = vpermps_avx2(auVar158,auVar66);
    auVar66 = vpermps_avx512vl(auVar83,auVar82);
    auVar82 = vpermps_avx512vl(auVar158,auVar82);
    auVar41 = vfmadd132ps_fma(auVar70,auVar169,_DAT_01faff20);
    auVar70 = vsubps_avx(auVar228,ZEXT1632(auVar41));
    auVar83 = vmulps_avx512vl(auVar75,ZEXT1632(auVar41));
    auVar88 = ZEXT1632(auVar41);
    auVar84 = vmulps_avx512vl(auVar69,auVar88);
    auVar45 = vfmadd231ps_fma(auVar83,auVar70,auVar128);
    auVar83._16_16_ = vfmadd231ps_fma(auVar84,auVar70,auVar68);
    auVar84 = vmulps_avx512vl(auVar76,auVar88);
    auVar85 = vmulps_avx512vl(auVar77,auVar88);
    auVar75 = vfmadd231ps_avx512vl(auVar84,auVar70,auVar75);
    auVar69 = vfmadd231ps_avx512vl(auVar85,auVar70,auVar69);
    auVar84 = vmulps_avx512vl(auVar78,auVar88);
    auVar85 = ZEXT1632(auVar41);
    auVar79 = vmulps_avx512vl(auVar79,auVar85);
    auVar76 = vfmadd231ps_avx512vl(auVar84,auVar70,auVar76);
    auVar77 = vfmadd231ps_avx512vl(auVar79,auVar70,auVar77);
    fVar200 = auVar41._0_4_;
    fVar202 = auVar41._4_4_;
    auVar17._4_4_ = fVar202 * auVar75._4_4_;
    auVar17._0_4_ = fVar200 * auVar75._0_4_;
    fVar204 = auVar41._8_4_;
    auVar17._8_4_ = fVar204 * auVar75._8_4_;
    fVar205 = auVar41._12_4_;
    auVar17._12_4_ = fVar205 * auVar75._12_4_;
    auVar17._16_4_ = auVar75._16_4_ * 0.0;
    auVar17._20_4_ = auVar75._20_4_ * 0.0;
    auVar17._24_4_ = auVar75._24_4_ * 0.0;
    auVar17._28_4_ = fVar101;
    auVar18._4_4_ = fVar202 * auVar69._4_4_;
    auVar18._0_4_ = fVar200 * auVar69._0_4_;
    auVar18._8_4_ = fVar204 * auVar69._8_4_;
    auVar18._12_4_ = fVar205 * auVar69._12_4_;
    auVar18._16_4_ = auVar69._16_4_ * 0.0;
    auVar18._20_4_ = auVar69._20_4_ * 0.0;
    auVar18._24_4_ = auVar69._24_4_ * 0.0;
    auVar18._28_4_ = auVar68._28_4_;
    auVar45 = vfmadd231ps_fma(auVar17,auVar70,ZEXT1632(auVar45));
    auVar83._16_16_ = vfmadd231ps_fma(auVar18,auVar70,ZEXT1632(auVar83._16_16_));
    auVar120._0_4_ = fVar200 * auVar76._0_4_;
    auVar120._4_4_ = fVar202 * auVar76._4_4_;
    auVar120._8_4_ = fVar204 * auVar76._8_4_;
    auVar120._12_4_ = fVar205 * auVar76._12_4_;
    auVar120._16_4_ = auVar76._16_4_ * 0.0;
    auVar120._20_4_ = auVar76._20_4_ * 0.0;
    auVar120._24_4_ = auVar76._24_4_ * 0.0;
    auVar120._28_4_ = 0;
    auVar19._4_4_ = fVar202 * auVar77._4_4_;
    auVar19._0_4_ = fVar200 * auVar77._0_4_;
    auVar19._8_4_ = fVar204 * auVar77._8_4_;
    auVar19._12_4_ = fVar205 * auVar77._12_4_;
    auVar19._16_4_ = auVar77._16_4_ * 0.0;
    auVar19._20_4_ = auVar77._20_4_ * 0.0;
    auVar19._24_4_ = auVar77._24_4_ * 0.0;
    auVar19._28_4_ = auVar76._28_4_;
    auVar51 = vfmadd231ps_fma(auVar120,auVar70,auVar75);
    auVar52 = vfmadd231ps_fma(auVar19,auVar70,auVar69);
    auVar20._28_4_ = auVar69._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar205 * auVar52._12_4_,
                            CONCAT48(fVar204 * auVar52._8_4_,
                                     CONCAT44(fVar202 * auVar52._4_4_,fVar200 * auVar52._0_4_))));
    auVar57 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar205 * auVar51._12_4_,
                                                 CONCAT48(fVar204 * auVar51._8_4_,
                                                          CONCAT44(fVar202 * auVar51._4_4_,
                                                                   fVar200 * auVar51._0_4_)))),
                              auVar70,ZEXT1632(auVar45));
    auVar61 = vfmadd231ps_fma(auVar20,auVar70,ZEXT1632(auVar83._16_16_));
    auVar68 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar45));
    auVar75 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar83._16_16_));
    auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar68 = vmulps_avx512vl(auVar68,auVar69);
    auVar75 = vmulps_avx512vl(auVar75,auVar69);
    auVar180._0_4_ = fVar206 * auVar68._0_4_;
    auVar180._4_4_ = fVar206 * auVar68._4_4_;
    auVar180._8_4_ = fVar206 * auVar68._8_4_;
    auVar180._12_4_ = fVar206 * auVar68._12_4_;
    auVar180._16_4_ = fVar206 * auVar68._16_4_;
    auVar180._20_4_ = fVar206 * auVar68._20_4_;
    auVar180._24_4_ = fVar206 * auVar68._24_4_;
    auVar180._28_4_ = 0;
    auVar68 = vmulps_avx512vl(auVar187,auVar75);
    auVar83._16_16_ = vxorps_avx512vl(auVar78._0_16_,auVar78._0_16_);
    auVar75 = vpermt2ps_avx512vl(ZEXT1632(auVar57),_DAT_01feed00,ZEXT1632(auVar83._16_16_));
    auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar61),_DAT_01feed00,ZEXT1632(auVar83._16_16_));
    auVar121._0_4_ = auVar180._0_4_ + auVar57._0_4_;
    auVar121._4_4_ = auVar180._4_4_ + auVar57._4_4_;
    auVar121._8_4_ = auVar180._8_4_ + auVar57._8_4_;
    auVar121._12_4_ = auVar180._12_4_ + auVar57._12_4_;
    auVar121._16_4_ = auVar180._16_4_ + 0.0;
    auVar121._20_4_ = auVar180._20_4_ + 0.0;
    auVar121._24_4_ = auVar180._24_4_ + 0.0;
    auVar121._28_4_ = 0;
    auVar88 = ZEXT1632(auVar83._16_16_);
    auVar77 = vpermt2ps_avx512vl(auVar180,_DAT_01feed00,auVar88);
    auVar78 = vaddps_avx512vl(ZEXT1632(auVar61),auVar68);
    auVar79 = vpermt2ps_avx512vl(auVar68,_DAT_01feed00,auVar88);
    auVar68 = vsubps_avx(auVar75,auVar77);
    auVar77 = vsubps_avx512vl(auVar76,auVar79);
    auVar79 = vmulps_avx512vl(auVar81,auVar85);
    auVar84 = vmulps_avx512vl(auVar86,auVar85);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar70,auVar67);
    auVar67 = vfmadd231ps_avx512vl(auVar84,auVar70,auVar80);
    auVar80 = vmulps_avx512vl(auVar65,auVar85);
    auVar84 = vmulps_avx512vl(auVar87,auVar85);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar70,auVar81);
    auVar86 = vfmadd231ps_avx512vl(auVar84,auVar70,auVar86);
    auVar81 = vmulps_avx512vl(auVar66,auVar85);
    auVar66 = vmulps_avx512vl(auVar82,auVar85);
    auVar45 = vfmadd231ps_fma(auVar81,auVar70,auVar65);
    auVar81 = vfmadd231ps_avx512vl(auVar66,auVar70,auVar87);
    auVar65 = vmulps_avx512vl(auVar85,auVar80);
    auVar82 = ZEXT1632(auVar41);
    auVar66 = vmulps_avx512vl(auVar82,auVar86);
    auVar79 = vfmadd231ps_avx512vl(auVar65,auVar70,auVar79);
    auVar67 = vfmadd231ps_avx512vl(auVar66,auVar70,auVar67);
    auVar81 = vmulps_avx512vl(auVar82,auVar81);
    auVar80 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar205 * auVar45._12_4_,
                                            CONCAT48(fVar204 * auVar45._8_4_,
                                                     CONCAT44(fVar202 * auVar45._4_4_,
                                                              fVar200 * auVar45._0_4_)))),auVar70,
                         auVar80);
    auVar86 = vfmadd231ps_avx512vl(auVar81,auVar70,auVar86);
    auVar21._4_4_ = fVar202 * auVar80._4_4_;
    auVar21._0_4_ = fVar200 * auVar80._0_4_;
    auVar21._8_4_ = fVar204 * auVar80._8_4_;
    auVar21._12_4_ = fVar205 * auVar80._12_4_;
    auVar21._16_4_ = auVar80._16_4_ * 0.0;
    auVar21._20_4_ = auVar80._20_4_ * 0.0;
    auVar21._24_4_ = auVar80._24_4_ * 0.0;
    auVar21._28_4_ = auVar87._28_4_;
    auVar87 = vmulps_avx512vl(auVar82,auVar86);
    auVar81 = vfmadd231ps_avx512vl(auVar21,auVar70,auVar79);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar67,auVar70);
    auVar70 = vsubps_avx512vl(auVar80,auVar79);
    auVar86 = vsubps_avx512vl(auVar86,auVar67);
    auVar70 = vmulps_avx512vl(auVar70,auVar69);
    auVar86 = vmulps_avx512vl(auVar86,auVar69);
    fVar101 = fVar206 * auVar70._0_4_;
    fVar200 = fVar206 * auVar70._4_4_;
    auVar22._4_4_ = fVar200;
    auVar22._0_4_ = fVar101;
    fVar202 = fVar206 * auVar70._8_4_;
    auVar22._8_4_ = fVar202;
    fVar204 = fVar206 * auVar70._12_4_;
    auVar22._12_4_ = fVar204;
    fVar205 = fVar206 * auVar70._16_4_;
    auVar22._16_4_ = fVar205;
    fVar189 = fVar206 * auVar70._20_4_;
    auVar22._20_4_ = fVar189;
    fVar206 = fVar206 * auVar70._24_4_;
    auVar22._24_4_ = fVar206;
    auVar22._28_4_ = auVar70._28_4_;
    auVar86 = vmulps_avx512vl(auVar187,auVar86);
    auVar69 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,auVar88);
    auVar79 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,auVar88);
    auVar188._0_4_ = auVar81._0_4_ + fVar101;
    auVar188._4_4_ = auVar81._4_4_ + fVar200;
    auVar188._8_4_ = auVar81._8_4_ + fVar202;
    auVar188._12_4_ = auVar81._12_4_ + fVar204;
    auVar188._16_4_ = auVar81._16_4_ + fVar205;
    auVar188._20_4_ = auVar81._20_4_ + fVar189;
    auVar188._24_4_ = auVar81._24_4_ + fVar206;
    auVar188._28_4_ = auVar81._28_4_ + auVar70._28_4_;
    auVar70 = vpermt2ps_avx512vl(auVar22,_DAT_01feed00,ZEXT1632(auVar83._16_16_));
    auVar67 = vaddps_avx512vl(auVar87,auVar86);
    in_ZMM16 = ZEXT3264(auVar67);
    auVar86 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,ZEXT1632(auVar83._16_16_));
    auVar70 = vsubps_avx(auVar69,auVar70);
    auVar86 = vsubps_avx512vl(auVar79,auVar86);
    auVar133 = ZEXT1632(auVar57);
    auVar80 = vsubps_avx512vl(auVar81,auVar133);
    auVar145 = ZEXT1632(auVar61);
    auVar65 = vsubps_avx512vl(auVar87,auVar145);
    auVar66 = vsubps_avx512vl(auVar69,auVar75);
    auVar80 = vaddps_avx512vl(auVar80,auVar66);
    auVar66 = vsubps_avx512vl(auVar79,auVar76);
    auVar65 = vaddps_avx512vl(auVar65,auVar66);
    auVar66 = vmulps_avx512vl(auVar145,auVar80);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar133,auVar65);
    auVar82 = vmulps_avx512vl(auVar78,auVar80);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar121,auVar65);
    auVar83 = vmulps_avx512vl(auVar77,auVar80);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar68,auVar65);
    auVar84 = vmulps_avx512vl(auVar76,auVar80);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar75,auVar65);
    auVar85 = vmulps_avx512vl(auVar87,auVar80);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar81,auVar65);
    auVar88 = vmulps_avx512vl(auVar67,auVar80);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar188,auVar65);
    auVar89 = vmulps_avx512vl(auVar86,auVar80);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar70,auVar65);
    auVar80 = vmulps_avx512vl(auVar79,auVar80);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar69,auVar65);
    auVar65 = vminps_avx512vl(auVar66,auVar82);
    auVar66 = vmaxps_avx512vl(auVar66,auVar82);
    auVar82 = vminps_avx512vl(auVar83,auVar84);
    auVar65 = vminps_avx512vl(auVar65,auVar82);
    auVar82 = vmaxps_avx512vl(auVar83,auVar84);
    auVar66 = vmaxps_avx512vl(auVar66,auVar82);
    auVar82 = vminps_avx512vl(auVar85,auVar88);
    auVar83 = vmaxps_avx512vl(auVar85,auVar88);
    auVar84 = vminps_avx512vl(auVar89,auVar80);
    auVar82 = vminps_avx512vl(auVar82,auVar84);
    auVar65 = vminps_avx512vl(auVar65,auVar82);
    auVar80 = vmaxps_avx512vl(auVar89,auVar80);
    auVar80 = vmaxps_avx512vl(auVar83,auVar80);
    auVar80 = vmaxps_avx512vl(auVar66,auVar80);
    uVar11 = vcmpps_avx512vl(auVar65,local_148,2);
    uVar12 = vcmpps_avx512vl(auVar80,local_168,5);
    bVar24 = (byte)uVar11 & (byte)uVar12 & 0x7f;
    if (bVar24 != 0) {
      auVar80 = vsubps_avx512vl(auVar75,auVar133);
      auVar65 = vsubps_avx512vl(auVar76,auVar145);
      auVar66 = vsubps_avx512vl(auVar69,auVar81);
      auVar80 = vaddps_avx512vl(auVar80,auVar66);
      auVar66 = vsubps_avx512vl(auVar79,auVar87);
      auVar65 = vaddps_avx512vl(auVar65,auVar66);
      auVar66 = vmulps_avx512vl(auVar145,auVar80);
      auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar65,auVar133);
      auVar78 = vmulps_avx512vl(auVar78,auVar80);
      auVar78 = vfnmadd213ps_avx512vl(auVar121,auVar65,auVar78);
      auVar77 = vmulps_avx512vl(auVar77,auVar80);
      auVar77 = vfnmadd213ps_avx512vl(auVar68,auVar65,auVar77);
      auVar68 = vmulps_avx512vl(auVar76,auVar80);
      auVar76 = vfnmadd231ps_avx512vl(auVar68,auVar65,auVar75);
      auVar68 = vmulps_avx512vl(auVar87,auVar80);
      auVar87 = vfnmadd231ps_avx512vl(auVar68,auVar65,auVar81);
      auVar68 = vmulps_avx512vl(auVar67,auVar80);
      auVar67 = vfnmadd213ps_avx512vl(auVar188,auVar65,auVar68);
      auVar68 = vmulps_avx512vl(auVar86,auVar80);
      auVar81 = vfnmadd213ps_avx512vl(auVar70,auVar65,auVar68);
      auVar70 = vmulps_avx512vl(auVar79,auVar80);
      auVar69 = vfnmadd231ps_avx512vl(auVar70,auVar69,auVar65);
      auVar68 = vminps_avx(auVar66,auVar78);
      auVar70 = vmaxps_avx(auVar66,auVar78);
      auVar75 = vminps_avx(auVar77,auVar76);
      auVar75 = vminps_avx(auVar68,auVar75);
      auVar68 = vmaxps_avx(auVar77,auVar76);
      auVar70 = vmaxps_avx(auVar70,auVar68);
      auVar86 = vminps_avx(auVar87,auVar67);
      auVar68 = vmaxps_avx(auVar87,auVar67);
      auVar87 = vminps_avx(auVar81,auVar69);
      auVar86 = vminps_avx(auVar86,auVar87);
      auVar86 = vminps_avx(auVar75,auVar86);
      auVar75 = vmaxps_avx(auVar81,auVar69);
      auVar68 = vmaxps_avx(auVar68,auVar75);
      auVar70 = vmaxps_avx(auVar70,auVar68);
      uVar11 = vcmpps_avx512vl(auVar70,local_168,5);
      uVar12 = vcmpps_avx512vl(auVar86,local_148,2);
      bVar24 = bVar24 & (byte)uVar11 & (byte)uVar12;
      if (bVar24 != 0) {
        auStack_338[uVar26] = (uint)bVar24;
        uVar11 = vmovlps_avx(auVar44);
        (&uStack_128)[uVar26] = uVar11;
        uVar39 = vmovlps_avx(auVar48);
        auStack_58[uVar26] = uVar39;
        uVar26 = (ulong)((int)uVar26 + 1);
      }
    }
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar236 = ZEXT1664(auVar44);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar238 = ZEXT1664(auVar44);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar239 = ZEXT1664(auVar44);
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar237 = ZEXT3264(auVar70);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar240 = ZEXT1664(auVar44);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar241 = ZEXT1664(auVar44);
    auVar242 = ZEXT3264(_DAT_01feed20);
    auVar83._16_16_ = DAT_01feed20._16_16_;
LAB_01cffd8f:
    do {
      do {
        if ((int)uVar26 == 0) {
          if (bVar32 != false) {
            return bVar32;
          }
          uVar102 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar16._4_4_ = uVar102;
          auVar16._0_4_ = uVar102;
          auVar16._8_4_ = uVar102;
          auVar16._12_4_ = uVar102;
          auVar16._16_4_ = uVar102;
          auVar16._20_4_ = uVar102;
          auVar16._24_4_ = uVar102;
          auVar16._28_4_ = uVar102;
          uVar11 = vcmpps_avx512vl(local_78,auVar16,2);
          uVar33 = (uint)uVar31 & (uint)uVar31 + 0xff & (uint)uVar11;
          uVar31 = (ulong)uVar33;
          if (uVar33 == 0) {
            return false;
          }
          goto LAB_01cff1a0;
        }
        uVar25 = (int)uVar26 - 1;
        uVar27 = (ulong)uVar25;
        uVar6 = auStack_338[uVar27];
        auVar48._8_8_ = 0;
        auVar48._0_8_ = auStack_58[uVar27];
        uVar39 = 0;
        for (uVar30 = (ulong)uVar6; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          uVar39 = uVar39 + 1;
        }
        uVar29 = uVar6 - 1 & uVar6;
        bVar37 = uVar29 == 0;
        auStack_338[uVar27] = uVar29;
        if (bVar37) {
          uVar26 = (ulong)uVar25;
        }
        auVar105._8_8_ = 0;
        auVar105._0_8_ = uVar39;
        auVar44 = vpunpcklqdq_avx(auVar105,ZEXT416((int)uVar39 + 1));
        auVar44 = vcvtqq2ps_avx512vl(auVar44);
        auVar44 = vmulps_avx512vl(auVar44,auVar240._0_16_);
        uVar102 = *(undefined4 *)((long)&uStack_128 + uVar27 * 8 + 4);
        auVar13._4_4_ = uVar102;
        auVar13._0_4_ = uVar102;
        auVar13._8_4_ = uVar102;
        auVar13._12_4_ = uVar102;
        auVar41 = vmulps_avx512vl(auVar44,auVar13);
        auVar45 = auVar241._0_16_;
        auVar44 = vsubps_avx512vl(auVar45,auVar44);
        uVar102 = *(undefined4 *)(&uStack_128 + uVar27);
        auVar14._4_4_ = uVar102;
        auVar14._0_4_ = uVar102;
        auVar14._8_4_ = uVar102;
        auVar14._12_4_ = uVar102;
        auVar44 = vfmadd231ps_avx512vl(auVar41,auVar44,auVar14);
        auVar41 = vmovshdup_avx(auVar44);
        fVar206 = auVar41._0_4_ - auVar44._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar206));
        if (uVar6 == 0 || bVar37) goto LAB_01cff894;
        auVar41 = vshufps_avx(auVar48,auVar48,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar206));
        auVar52 = vsubps_avx512vl(auVar45,auVar41);
        fVar101 = auVar41._0_4_;
        auVar140._0_4_ = fVar101 * fVar109;
        fVar200 = auVar41._4_4_;
        auVar140._4_4_ = fVar200 * fVar110;
        fVar202 = auVar41._8_4_;
        auVar140._8_4_ = fVar202 * fVar109;
        fVar204 = auVar41._12_4_;
        auVar140._12_4_ = fVar204 * fVar110;
        auVar149._0_4_ = fVar101 * fVar111;
        auVar149._4_4_ = fVar200 * fVar112;
        auVar149._8_4_ = fVar202 * fVar111;
        auVar149._12_4_ = fVar204 * fVar112;
        auVar154._0_4_ = fVar101 * fVar122;
        auVar154._4_4_ = fVar200 * fVar159;
        auVar154._8_4_ = fVar202 * fVar122;
        auVar154._12_4_ = fVar204 * fVar159;
        auVar123._0_4_ = fVar101 * fVar199;
        auVar123._4_4_ = fVar200 * fVar201;
        auVar123._8_4_ = fVar202 * fVar199;
        auVar123._12_4_ = fVar204 * fVar201;
        auVar41 = vfmadd231ps_fma(auVar140,auVar52,auVar50);
        auVar83._16_16_ = vfmadd231ps_fma(auVar149,auVar52,auVar47);
        auVar51 = vfmadd231ps_fma(auVar154,auVar52,auVar162);
        auVar52 = vfmadd231ps_fma(auVar123,auVar52,auVar171);
        auVar134._16_16_ = auVar41;
        auVar134._0_16_ = auVar41;
        auVar146._16_16_ = auVar83._16_16_;
        auVar146._0_16_ = auVar83._16_16_;
        auVar153._16_16_ = auVar51;
        auVar153._0_16_ = auVar51;
        auVar68 = vpermps_avx512vl(auVar242._0_32_,ZEXT1632(auVar44));
        auVar70 = vsubps_avx(auVar146,auVar134);
        auVar83._16_16_ = vfmadd213ps_fma(auVar70,auVar68,auVar134);
        auVar70 = vsubps_avx(auVar153,auVar146);
        auVar57 = vfmadd213ps_fma(auVar70,auVar68,auVar146);
        auVar41 = vsubps_avx(auVar52,auVar51);
        auVar147._16_16_ = auVar41;
        auVar147._0_16_ = auVar41;
        auVar41 = vfmadd213ps_fma(auVar147,auVar68,auVar153);
        auVar70 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar83._16_16_));
        auVar83._16_16_ = vfmadd213ps_fma(auVar70,auVar68,ZEXT1632(auVar83._16_16_));
        auVar70 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar57));
        auVar41 = vfmadd213ps_fma(auVar70,auVar68,ZEXT1632(auVar57));
        auVar70 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar83._16_16_));
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar83._16_16_),auVar70,auVar68);
        auVar70 = vmulps_avx512vl(auVar70,auVar237._0_32_);
        auVar83._16_16_ = auVar70._16_16_;
        fVar101 = fVar206 * 0.33333334;
        auVar155._0_8_ =
             CONCAT44(auVar114._4_4_ + fVar101 * auVar70._4_4_,
                      auVar114._0_4_ + fVar101 * auVar70._0_4_);
        auVar155._8_4_ = auVar114._8_4_ + fVar101 * auVar70._8_4_;
        auVar155._12_4_ = auVar114._12_4_ + fVar101 * auVar70._12_4_;
        auVar141._0_4_ = fVar101 * auVar70._16_4_;
        auVar141._4_4_ = fVar101 * auVar70._20_4_;
        auVar141._8_4_ = fVar101 * auVar70._24_4_;
        auVar141._12_4_ = fVar101 * auVar70._28_4_;
        auVar60 = vsubps_avx((undefined1  [16])0x0,auVar141);
        auVar61 = vshufpd_avx(auVar114,auVar114,3);
        auVar64 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar41 = vsubps_avx(auVar61,auVar114);
        auVar51 = vsubps_avx(auVar64,(undefined1  [16])0x0);
        auVar172._0_4_ = auVar41._0_4_ + auVar51._0_4_;
        auVar172._4_4_ = auVar41._4_4_ + auVar51._4_4_;
        auVar172._8_4_ = auVar41._8_4_ + auVar51._8_4_;
        auVar172._12_4_ = auVar41._12_4_ + auVar51._12_4_;
        auVar41 = vshufps_avx(auVar114,auVar114,0xb1);
        auVar51 = vshufps_avx(auVar155,auVar155,0xb1);
        auVar52 = vshufps_avx(auVar60,auVar60,0xb1);
        auVar57 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar226._4_4_ = auVar172._0_4_;
        auVar226._0_4_ = auVar172._0_4_;
        auVar226._8_4_ = auVar172._0_4_;
        auVar226._12_4_ = auVar172._0_4_;
        auVar55 = vshufps_avx(auVar172,auVar172,0x55);
        fVar101 = auVar55._0_4_;
        auVar184._0_4_ = auVar41._0_4_ * fVar101;
        fVar200 = auVar55._4_4_;
        auVar184._4_4_ = auVar41._4_4_ * fVar200;
        fVar202 = auVar55._8_4_;
        auVar184._8_4_ = auVar41._8_4_ * fVar202;
        fVar204 = auVar55._12_4_;
        auVar184._12_4_ = auVar41._12_4_ * fVar204;
        auVar191._0_4_ = auVar51._0_4_ * fVar101;
        auVar191._4_4_ = auVar51._4_4_ * fVar200;
        auVar191._8_4_ = auVar51._8_4_ * fVar202;
        auVar191._12_4_ = auVar51._12_4_ * fVar204;
        auVar209._0_4_ = auVar52._0_4_ * fVar101;
        auVar209._4_4_ = auVar52._4_4_ * fVar200;
        auVar209._8_4_ = auVar52._8_4_ * fVar202;
        auVar209._12_4_ = auVar52._12_4_ * fVar204;
        auVar173._0_4_ = auVar57._0_4_ * fVar101;
        auVar173._4_4_ = auVar57._4_4_ * fVar200;
        auVar173._8_4_ = auVar57._8_4_ * fVar202;
        auVar173._12_4_ = auVar57._12_4_ * fVar204;
        auVar41 = vfmadd231ps_fma(auVar184,auVar226,auVar114);
        auVar51 = vfmadd231ps_fma(auVar191,auVar226,auVar155);
        auVar58 = vfmadd231ps_fma(auVar209,auVar226,auVar60);
        auVar59 = vfmadd231ps_fma(auVar173,(undefined1  [16])0x0,auVar226);
        auVar55 = vshufpd_avx(auVar41,auVar41,1);
        auVar56 = vshufpd_avx(auVar51,auVar51,1);
        auVar53 = vshufpd_avx512vl(auVar58,auVar58,1);
        auVar54 = vshufpd_avx512vl(auVar59,auVar59,1);
        auVar52 = vminss_avx(auVar41,auVar51);
        auVar41 = vmaxss_avx(auVar51,auVar41);
        auVar57 = vminss_avx(auVar58,auVar59);
        auVar51 = vmaxss_avx(auVar59,auVar58);
        auVar52 = vminss_avx(auVar52,auVar57);
        auVar41 = vmaxss_avx(auVar51,auVar41);
        auVar57 = vminss_avx(auVar55,auVar56);
        auVar51 = vmaxss_avx(auVar56,auVar55);
        auVar55 = vminss_avx512f(auVar53,auVar54);
        auVar56 = vmaxss_avx512f(auVar54,auVar53);
        auVar51 = vmaxss_avx(auVar56,auVar51);
        auVar57 = vminss_avx512f(auVar57,auVar55);
        in_ZMM16 = ZEXT1664(auVar57);
        fVar200 = auVar51._0_4_;
        fVar101 = auVar41._0_4_;
        if (auVar52._0_4_ < 0.0001) {
          bVar38 = fVar200 == -0.0001;
          bVar35 = NAN(fVar200);
          if (fVar200 <= -0.0001) goto LAB_01cfffb9;
          break;
        }
LAB_01cfffb9:
        vucomiss_avx512f(auVar57);
        bVar38 = fVar200 <= -0.0001;
        bVar36 = -0.0001 < fVar101;
        bVar35 = bVar38;
        if (!bVar38) break;
        uVar11 = vcmpps_avx512vl(auVar52,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar12 = vcmpps_avx512vl(auVar57,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar25 = (uint)uVar11 & (uint)uVar12;
        bVar23 = (uVar25 & 1) == 0;
        bVar38 = bVar36 && bVar23;
        bVar35 = bVar36 && (uVar25 & 1) == 0;
      } while (!bVar36 || !bVar23);
      auVar58 = auVar244._0_16_;
      vcmpss_avx512f(auVar52,auVar58,1);
      uVar11 = vcmpss_avx512f(auVar41,auVar58,1);
      bVar36 = (bool)((byte)uVar11 & 1);
      auVar83._0_16_ = auVar245._0_16_;
      auVar90._4_28_ = auVar83._4_28_;
      auVar90._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar245._0_4_);
      vucomiss_avx512f(auVar90._0_16_);
      bVar35 = (bool)(!bVar38 | bVar35);
      bVar36 = bVar35 == false;
      auVar92._16_16_ = auVar83._16_16_;
      auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (uint)bVar35 * auVar244._0_4_ + (uint)!bVar35 * 0x7f800000;
      auVar56 = auVar91._0_16_;
      auVar94._16_16_ = auVar83._16_16_;
      auVar94._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (uint)bVar35 * auVar244._0_4_ + (uint)!bVar35 * -0x800000;
      auVar55 = auVar93._0_16_;
      uVar11 = vcmpss_avx512f(auVar57,auVar58,1);
      bVar38 = (bool)((byte)uVar11 & 1);
      auVar96._16_16_ = auVar83._16_16_;
      auVar96._0_16_ = auVar245._0_16_;
      auVar95._4_28_ = auVar96._4_28_;
      auVar95._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar245._0_4_);
      vucomiss_avx512f(auVar95._0_16_);
      if ((bVar35) || (bVar36)) {
        auVar57 = vucomiss_avx512f(auVar52);
        if ((bVar35) || (bVar36)) {
          auVar59 = vxorps_avx512vl(auVar52,auVar239._0_16_);
          auVar52 = vsubss_avx512f(auVar57,auVar52);
          auVar52 = vdivss_avx512f(auVar59,auVar52);
          auVar57 = vsubss_avx512f(ZEXT416(0x3f800000),auVar52);
          auVar52 = vfmadd213ss_avx512f(auVar57,auVar58,auVar52);
          in_ZMM16 = ZEXT1664(auVar52);
        }
        else {
          auVar52 = vxorps_avx512vl(auVar57,auVar57);
          in_ZMM16 = ZEXT1664(auVar52);
          vucomiss_avx512f(auVar52);
          auVar52 = ZEXT416(0x3f800000);
          if ((bVar35) || (bVar36)) {
            in_ZMM16 = ZEXT464(0x7f800000);
            auVar52 = SUB6416(ZEXT464(0xff800000),0);
          }
        }
        auVar56 = vminss_avx512f(auVar56,in_ZMM16._0_16_);
        auVar55 = vmaxss_avx(auVar52,auVar55);
      }
      auVar245 = ZEXT464(0x3f800000);
      uVar11 = vcmpss_avx512f(auVar51,auVar58,1);
      bVar38 = (bool)((byte)uVar11 & 1);
      auVar51 = auVar245._0_16_;
      fVar202 = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * 0x3f800000);
      if ((auVar90._0_4_ != fVar202) || (NAN(auVar90._0_4_) || NAN(fVar202))) {
        if ((fVar200 != fVar101) || (NAN(fVar200) || NAN(fVar101))) {
          auVar41 = vxorps_avx512vl(auVar41,auVar239._0_16_);
          auVar174._0_4_ = auVar41._0_4_ / (fVar200 - fVar101);
          auVar174._4_12_ = auVar41._4_12_;
          auVar41 = vsubss_avx512f(auVar51,auVar174);
          auVar41 = vfmadd213ss_avx512f(auVar41,auVar58,auVar174);
          auVar52 = auVar41;
        }
        else if ((fVar101 != 0.0) ||
                (auVar41 = auVar51, auVar52 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar101))) {
          auVar41 = SUB6416(ZEXT464(0xff800000),0);
          auVar52 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar56 = vminss_avx(auVar56,auVar52);
        auVar55 = vmaxss_avx(auVar41,auVar55);
      }
      bVar38 = auVar95._0_4_ != fVar202;
      auVar41 = vminss_avx512f(auVar56,auVar51);
      auVar98._16_16_ = auVar83._16_16_;
      auVar98._0_16_ = auVar56;
      auVar97._4_28_ = auVar98._4_28_;
      auVar97._0_4_ = (uint)bVar38 * auVar41._0_4_ + (uint)!bVar38 * auVar56._0_4_;
      auVar41 = vmaxss_avx512f(auVar51,auVar55);
      auVar100._16_16_ = auVar83._16_16_;
      auVar100._0_16_ = auVar55;
      auVar99._4_28_ = auVar100._4_28_;
      auVar99._0_4_ = (uint)bVar38 * auVar41._0_4_ + (uint)!bVar38 * auVar55._0_4_;
      auVar41 = vmaxss_avx512f(auVar58,auVar97._0_16_);
      auVar52 = vminss_avx512f(auVar99._0_16_,auVar51);
    } while (auVar52._0_4_ < auVar41._0_4_);
    auVar58 = vmaxss_avx512f(auVar58,ZEXT416((uint)(auVar41._0_4_ + -0.1)));
    auVar59 = vminss_avx512f(ZEXT416((uint)(auVar52._0_4_ + 0.1)),auVar51);
    auVar124._0_8_ = auVar114._0_8_;
    auVar124._8_8_ = auVar124._0_8_;
    auVar192._8_8_ = auVar155._0_8_;
    auVar192._0_8_ = auVar155._0_8_;
    auVar210._8_8_ = auVar60._0_8_;
    auVar210._0_8_ = auVar60._0_8_;
    auVar41 = vshufpd_avx(auVar155,auVar155,3);
    auVar52 = vshufpd_avx(auVar60,auVar60,3);
    auVar57 = vshufps_avx(auVar58,auVar59,0);
    auVar56 = vsubps_avx512vl(auVar45,auVar57);
    fVar101 = auVar57._0_4_;
    auVar150._0_4_ = fVar101 * auVar61._0_4_;
    fVar200 = auVar57._4_4_;
    auVar150._4_4_ = fVar200 * auVar61._4_4_;
    fVar202 = auVar57._8_4_;
    auVar150._8_4_ = fVar202 * auVar61._8_4_;
    fVar204 = auVar57._12_4_;
    auVar150._12_4_ = fVar204 * auVar61._12_4_;
    auVar156._0_4_ = fVar101 * auVar41._0_4_;
    auVar156._4_4_ = fVar200 * auVar41._4_4_;
    auVar156._8_4_ = fVar202 * auVar41._8_4_;
    auVar156._12_4_ = fVar204 * auVar41._12_4_;
    auVar230._0_4_ = auVar52._0_4_ * fVar101;
    auVar230._4_4_ = auVar52._4_4_ * fVar200;
    auVar230._8_4_ = auVar52._8_4_ * fVar202;
    auVar230._12_4_ = auVar52._12_4_ * fVar204;
    auVar142._0_4_ = fVar101 * auVar64._0_4_;
    auVar142._4_4_ = fVar200 * auVar64._4_4_;
    auVar142._8_4_ = fVar202 * auVar64._8_4_;
    auVar142._12_4_ = fVar204 * auVar64._12_4_;
    auVar61 = vfmadd231ps_fma(auVar150,auVar56,auVar124);
    auVar64 = vfmadd231ps_fma(auVar156,auVar56,auVar192);
    auVar55 = vfmadd231ps_fma(auVar230,auVar56,auVar210);
    auVar56 = vfmadd231ps_fma(auVar142,auVar56,ZEXT816(0));
    auVar52 = vsubss_avx512f(auVar51,auVar58);
    auVar41 = vmovshdup_avx(auVar48);
    auVar114 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * auVar58._0_4_)),auVar48,auVar52);
    auVar52 = vsubss_avx512f(auVar51,auVar59);
    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * auVar59._0_4_)),auVar48,auVar52);
    auVar60 = vdivss_avx512f(auVar51,ZEXT416((uint)fVar206));
    auVar41 = vsubps_avx(auVar64,auVar61);
    auVar129 = auVar236._0_16_;
    auVar52 = vmulps_avx512vl(auVar41,auVar129);
    auVar41 = vsubps_avx(auVar55,auVar64);
    auVar57 = vmulps_avx512vl(auVar41,auVar129);
    auVar41 = vsubps_avx(auVar56,auVar55);
    auVar41 = vmulps_avx512vl(auVar41,auVar129);
    auVar48 = vminps_avx(auVar57,auVar41);
    auVar41 = vmaxps_avx(auVar57,auVar41);
    auVar48 = vminps_avx(auVar52,auVar48);
    auVar41 = vmaxps_avx(auVar52,auVar41);
    auVar52 = vshufpd_avx(auVar48,auVar48,3);
    auVar57 = vshufpd_avx(auVar41,auVar41,3);
    auVar48 = vminps_avx(auVar48,auVar52);
    auVar41 = vmaxps_avx(auVar41,auVar57);
    fVar206 = auVar60._0_4_;
    auVar175._0_4_ = auVar48._0_4_ * fVar206;
    auVar175._4_4_ = auVar48._4_4_ * fVar206;
    auVar175._8_4_ = auVar48._8_4_ * fVar206;
    auVar175._12_4_ = auVar48._12_4_ * fVar206;
    auVar163._0_4_ = fVar206 * auVar41._0_4_;
    auVar163._4_4_ = fVar206 * auVar41._4_4_;
    auVar163._8_4_ = fVar206 * auVar41._8_4_;
    auVar163._12_4_ = fVar206 * auVar41._12_4_;
    auVar60 = vdivss_avx512f(auVar51,ZEXT416((uint)(auVar53._0_4_ - auVar114._0_4_)));
    auVar41 = vshufpd_avx(auVar61,auVar61,3);
    auVar48 = vshufpd_avx(auVar64,auVar64,3);
    auVar52 = vshufpd_avx(auVar55,auVar55,3);
    auVar57 = vshufpd_avx(auVar56,auVar56,3);
    auVar41 = vsubps_avx(auVar41,auVar61);
    auVar61 = vsubps_avx(auVar48,auVar64);
    auVar64 = vsubps_avx(auVar52,auVar55);
    auVar57 = vsubps_avx(auVar57,auVar56);
    auVar48 = vminps_avx(auVar41,auVar61);
    auVar41 = vmaxps_avx(auVar41,auVar61);
    auVar52 = vminps_avx(auVar64,auVar57);
    auVar52 = vminps_avx(auVar48,auVar52);
    auVar48 = vmaxps_avx(auVar64,auVar57);
    auVar41 = vmaxps_avx(auVar41,auVar48);
    fVar206 = auVar60._0_4_;
    auVar211._0_4_ = fVar206 * auVar52._0_4_;
    auVar211._4_4_ = fVar206 * auVar52._4_4_;
    auVar211._8_4_ = fVar206 * auVar52._8_4_;
    auVar211._12_4_ = fVar206 * auVar52._12_4_;
    auVar193._0_4_ = fVar206 * auVar41._0_4_;
    auVar193._4_4_ = fVar206 * auVar41._4_4_;
    auVar193._8_4_ = fVar206 * auVar41._8_4_;
    auVar193._12_4_ = fVar206 * auVar41._12_4_;
    auVar57 = vinsertps_avx(auVar44,auVar114,0x10);
    auVar54 = vpermt2ps_avx512vl(auVar44,_DAT_01feecd0,auVar53);
    auVar113._0_4_ = auVar57._0_4_ + auVar54._0_4_;
    auVar113._4_4_ = auVar57._4_4_ + auVar54._4_4_;
    auVar113._8_4_ = auVar57._8_4_ + auVar54._8_4_;
    auVar113._12_4_ = auVar57._12_4_ + auVar54._12_4_;
    auVar15._8_4_ = 0x3f000000;
    auVar15._0_8_ = 0x3f0000003f000000;
    auVar15._12_4_ = 0x3f000000;
    auVar60 = vmulps_avx512vl(auVar113,auVar15);
    auVar48 = vshufps_avx(auVar60,auVar60,0x54);
    uVar102 = auVar60._0_4_;
    auVar116._4_4_ = uVar102;
    auVar116._0_4_ = uVar102;
    auVar116._8_4_ = uVar102;
    auVar116._12_4_ = uVar102;
    auVar52 = vfmadd213ps_fma(auVar40,auVar116,auVar3);
    auVar61 = vfmadd213ps_fma(local_178,auVar116,auVar49);
    auVar64 = vfmadd213ps_fma(local_188,auVar116,auVar46);
    auVar41 = vsubps_avx(auVar61,auVar52);
    auVar52 = vfmadd213ps_fma(auVar41,auVar116,auVar52);
    auVar41 = vsubps_avx(auVar64,auVar61);
    auVar41 = vfmadd213ps_fma(auVar41,auVar116,auVar61);
    auVar41 = vsubps_avx(auVar41,auVar52);
    auVar52 = vfmadd231ps_fma(auVar52,auVar41,auVar116);
    auVar55 = vmulps_avx512vl(auVar41,auVar129);
    auVar220._8_8_ = auVar52._0_8_;
    auVar220._0_8_ = auVar52._0_8_;
    auVar41 = vshufpd_avx(auVar52,auVar52,3);
    auVar52 = vshufps_avx(auVar60,auVar60,0x55);
    auVar61 = vsubps_avx(auVar41,auVar220);
    auVar64 = vfmadd231ps_fma(auVar220,auVar52,auVar61);
    auVar231._8_8_ = auVar55._0_8_;
    auVar231._0_8_ = auVar55._0_8_;
    auVar41 = vshufpd_avx(auVar55,auVar55,3);
    auVar41 = vsubps_avx512vl(auVar41,auVar231);
    auVar41 = vfmadd213ps_avx512vl(auVar41,auVar52,auVar231);
    auVar117._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
    auVar117._8_4_ = auVar61._8_4_ ^ 0x80000000;
    auVar117._12_4_ = auVar61._12_4_ ^ 0x80000000;
    auVar52 = vmovshdup_avx512vl(auVar41);
    auVar232._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
    auVar232._8_4_ = auVar52._8_4_ ^ 0x80000000;
    auVar232._12_4_ = auVar52._12_4_ ^ 0x80000000;
    auVar55 = vmovshdup_avx512vl(auVar61);
    auVar56 = vpermt2ps_avx512vl(auVar232,ZEXT416(5),auVar61);
    auVar52 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar52._0_4_ * auVar61._0_4_)),auVar41,auVar55);
    auVar61 = vpermt2ps_avx512vl(auVar41,SUB6416(ZEXT464(4),0),auVar117);
    auVar143._0_4_ = auVar52._0_4_;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar41 = vdivps_avx(auVar56,auVar143);
    auVar62 = vdivps_avx512vl(auVar61,auVar143);
    fVar206 = auVar64._0_4_;
    auVar52 = vshufps_avx(auVar64,auVar64,0x55);
    auVar221._0_4_ = fVar206 * auVar41._0_4_ + auVar52._0_4_ * auVar62._0_4_;
    auVar221._4_4_ = fVar206 * auVar41._4_4_ + auVar52._4_4_ * auVar62._4_4_;
    auVar221._8_4_ = fVar206 * auVar41._8_4_ + auVar52._8_4_ * auVar62._8_4_;
    auVar221._12_4_ = fVar206 * auVar41._12_4_ + auVar52._12_4_ * auVar62._12_4_;
    auVar58 = vsubps_avx(auVar48,auVar221);
    auVar52 = vmovshdup_avx(auVar41);
    auVar48 = vinsertps_avx(auVar175,auVar211,0x1c);
    auVar233._0_4_ = auVar52._0_4_ * auVar48._0_4_;
    auVar233._4_4_ = auVar52._4_4_ * auVar48._4_4_;
    auVar233._8_4_ = auVar52._8_4_ * auVar48._8_4_;
    auVar233._12_4_ = auVar52._12_4_ * auVar48._12_4_;
    auVar59 = vinsertps_avx512f(auVar163,auVar193,0x1c);
    auVar52 = vmulps_avx512vl(auVar52,auVar59);
    auVar56 = vminps_avx512vl(auVar233,auVar52);
    auVar64 = vmaxps_avx(auVar52,auVar233);
    auVar55 = vmovshdup_avx(auVar62);
    auVar52 = vinsertps_avx(auVar211,auVar175,0x4c);
    auVar212._0_4_ = auVar55._0_4_ * auVar52._0_4_;
    auVar212._4_4_ = auVar55._4_4_ * auVar52._4_4_;
    auVar212._8_4_ = auVar55._8_4_ * auVar52._8_4_;
    auVar212._12_4_ = auVar55._12_4_ * auVar52._12_4_;
    auVar61 = vinsertps_avx(auVar193,auVar163,0x4c);
    auVar194._0_4_ = auVar55._0_4_ * auVar61._0_4_;
    auVar194._4_4_ = auVar55._4_4_ * auVar61._4_4_;
    auVar194._8_4_ = auVar55._8_4_ * auVar61._8_4_;
    auVar194._12_4_ = auVar55._12_4_ * auVar61._12_4_;
    auVar55 = vminps_avx(auVar212,auVar194);
    auVar56 = vaddps_avx512vl(auVar56,auVar55);
    auVar55 = vmaxps_avx(auVar194,auVar212);
    auVar195._0_4_ = auVar64._0_4_ + auVar55._0_4_;
    auVar195._4_4_ = auVar64._4_4_ + auVar55._4_4_;
    auVar195._8_4_ = auVar64._8_4_ + auVar55._8_4_;
    auVar195._12_4_ = auVar64._12_4_ + auVar55._12_4_;
    auVar213._8_8_ = 0x3f80000000000000;
    auVar213._0_8_ = 0x3f80000000000000;
    auVar64 = vsubps_avx(auVar213,auVar195);
    auVar55 = vsubps_avx(auVar213,auVar56);
    auVar56 = vsubps_avx(auVar57,auVar60);
    auVar60 = vsubps_avx(auVar54,auVar60);
    fVar204 = auVar56._0_4_;
    auVar234._0_4_ = fVar204 * auVar64._0_4_;
    fVar205 = auVar56._4_4_;
    auVar234._4_4_ = fVar205 * auVar64._4_4_;
    fVar189 = auVar56._8_4_;
    auVar234._8_4_ = fVar189 * auVar64._8_4_;
    fVar203 = auVar56._12_4_;
    auVar234._12_4_ = fVar203 * auVar64._12_4_;
    auVar63 = vbroadcastss_avx512vl(auVar41);
    auVar48 = vmulps_avx512vl(auVar63,auVar48);
    auVar59 = vmulps_avx512vl(auVar63,auVar59);
    auVar63 = vminps_avx512vl(auVar48,auVar59);
    auVar59 = vmaxps_avx512vl(auVar59,auVar48);
    auVar48 = vbroadcastss_avx512vl(auVar62);
    auVar52 = vmulps_avx512vl(auVar48,auVar52);
    auVar48 = vmulps_avx512vl(auVar48,auVar61);
    auVar61 = vminps_avx512vl(auVar52,auVar48);
    auVar61 = vaddps_avx512vl(auVar63,auVar61);
    auVar56 = vmulps_avx512vl(auVar56,auVar55);
    fVar206 = auVar60._0_4_;
    auVar196._0_4_ = fVar206 * auVar64._0_4_;
    fVar101 = auVar60._4_4_;
    auVar196._4_4_ = fVar101 * auVar64._4_4_;
    fVar200 = auVar60._8_4_;
    auVar196._8_4_ = fVar200 * auVar64._8_4_;
    fVar202 = auVar60._12_4_;
    auVar196._12_4_ = fVar202 * auVar64._12_4_;
    auVar214._0_4_ = fVar206 * auVar55._0_4_;
    auVar214._4_4_ = fVar101 * auVar55._4_4_;
    auVar214._8_4_ = fVar200 * auVar55._8_4_;
    auVar214._12_4_ = fVar202 * auVar55._12_4_;
    auVar48 = vmaxps_avx(auVar48,auVar52);
    auVar164._0_4_ = auVar59._0_4_ + auVar48._0_4_;
    auVar164._4_4_ = auVar59._4_4_ + auVar48._4_4_;
    auVar164._8_4_ = auVar59._8_4_ + auVar48._8_4_;
    auVar164._12_4_ = auVar59._12_4_ + auVar48._12_4_;
    auVar176._8_8_ = 0x3f800000;
    auVar176._0_8_ = 0x3f800000;
    auVar48 = vsubps_avx(auVar176,auVar164);
    auVar52 = vsubps_avx512vl(auVar176,auVar61);
    auVar227._0_4_ = fVar204 * auVar48._0_4_;
    auVar227._4_4_ = fVar205 * auVar48._4_4_;
    auVar227._8_4_ = fVar189 * auVar48._8_4_;
    auVar227._12_4_ = fVar203 * auVar48._12_4_;
    auVar222._0_4_ = fVar204 * auVar52._0_4_;
    auVar222._4_4_ = fVar205 * auVar52._4_4_;
    auVar222._8_4_ = fVar189 * auVar52._8_4_;
    auVar222._12_4_ = fVar203 * auVar52._12_4_;
    auVar165._0_4_ = fVar206 * auVar48._0_4_;
    auVar165._4_4_ = fVar101 * auVar48._4_4_;
    auVar165._8_4_ = fVar200 * auVar48._8_4_;
    auVar165._12_4_ = fVar202 * auVar48._12_4_;
    auVar177._0_4_ = fVar206 * auVar52._0_4_;
    auVar177._4_4_ = fVar101 * auVar52._4_4_;
    auVar177._8_4_ = fVar200 * auVar52._8_4_;
    auVar177._12_4_ = fVar202 * auVar52._12_4_;
    auVar48 = vminps_avx(auVar227,auVar222);
    auVar52 = vminps_avx512vl(auVar165,auVar177);
    in_ZMM16 = ZEXT1664(auVar52);
    auVar61 = vminps_avx512vl(auVar48,auVar52);
    auVar48 = vmaxps_avx(auVar222,auVar227);
    auVar52 = vmaxps_avx(auVar177,auVar165);
    auVar52 = vmaxps_avx(auVar52,auVar48);
    auVar64 = vminps_avx512vl(auVar234,auVar56);
    auVar48 = vminps_avx(auVar196,auVar214);
    auVar48 = vminps_avx(auVar64,auVar48);
    auVar48 = vhaddps_avx(auVar61,auVar48);
    auVar64 = vmaxps_avx512vl(auVar56,auVar234);
    auVar61 = vmaxps_avx(auVar214,auVar196);
    auVar61 = vmaxps_avx(auVar61,auVar64);
    auVar52 = vhaddps_avx(auVar52,auVar61);
    auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
    auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
    auVar166._0_4_ = auVar48._0_4_ + auVar58._0_4_;
    auVar166._4_4_ = auVar48._4_4_ + auVar58._4_4_;
    auVar166._8_4_ = auVar48._8_4_ + auVar58._8_4_;
    auVar166._12_4_ = auVar48._12_4_ + auVar58._12_4_;
    auVar178._0_4_ = auVar52._0_4_ + auVar58._0_4_;
    auVar178._4_4_ = auVar52._4_4_ + auVar58._4_4_;
    auVar178._8_4_ = auVar52._8_4_ + auVar58._8_4_;
    auVar178._12_4_ = auVar52._12_4_ + auVar58._12_4_;
    auVar48 = vmaxps_avx(auVar57,auVar166);
    auVar52 = vminps_avx(auVar178,auVar54);
    uVar39 = vcmpps_avx512vl(auVar52,auVar48,1);
    auVar48 = ZEXT416(5);
    if ((uVar39 & 3) != 0) {
      auVar44 = vxorps_avx512vl(ZEXT416(5),auVar48);
      auVar244 = ZEXT1664(auVar44);
      goto LAB_01cffd8f;
    }
    uVar39 = vcmpps_avx512vl(auVar178,auVar54,1);
    uVar11 = vcmpps_avx512vl(auVar44,auVar166,1);
    if (((ushort)uVar11 & (ushort)uVar39 & 1) == 0) {
      bVar24 = 0;
    }
    else {
      auVar52 = vmovshdup_avx(auVar166);
      bVar24 = auVar114._0_4_ < auVar52._0_4_ & (byte)(uVar39 >> 1) & 0x7f;
    }
    auVar48 = vxorps_avx512vl(auVar48,auVar48);
    auVar244 = ZEXT1664(auVar48);
    if (((3 < (uint)uVar26 || uVar6 != 0 && !bVar37) | bVar24) == 1) {
      lVar28 = 200;
      do {
        auVar44 = vsubss_avx512f(auVar51,auVar58);
        fVar200 = auVar44._0_4_;
        fVar206 = fVar200 * fVar200 * fVar200;
        fVar202 = auVar58._0_4_;
        fVar101 = fVar202 * 3.0 * fVar200 * fVar200;
        fVar200 = fVar200 * fVar202 * fVar202 * 3.0;
        auVar132._4_4_ = fVar206;
        auVar132._0_4_ = fVar206;
        auVar132._8_4_ = fVar206;
        auVar132._12_4_ = fVar206;
        auVar125._4_4_ = fVar101;
        auVar125._0_4_ = fVar101;
        auVar125._8_4_ = fVar101;
        auVar125._12_4_ = fVar101;
        auVar106._4_4_ = fVar200;
        auVar106._0_4_ = fVar200;
        auVar106._8_4_ = fVar200;
        auVar106._12_4_ = fVar200;
        fVar202 = fVar202 * fVar202 * fVar202;
        auVar151._0_4_ = (float)local_348._0_4_ * fVar202;
        auVar151._4_4_ = (float)local_348._4_4_ * fVar202;
        auVar151._8_4_ = fStack_340 * fVar202;
        auVar151._12_4_ = fStack_33c * fVar202;
        auVar44 = vfmadd231ps_fma(auVar151,auVar46,auVar106);
        auVar44 = vfmadd231ps_fma(auVar44,auVar49,auVar125);
        auVar44 = vfmadd231ps_fma(auVar44,auVar3,auVar132);
        auVar107._8_8_ = auVar44._0_8_;
        auVar107._0_8_ = auVar44._0_8_;
        auVar44 = vshufpd_avx(auVar44,auVar44,3);
        auVar52 = vshufps_avx(auVar58,auVar58,0x55);
        auVar44 = vsubps_avx(auVar44,auVar107);
        auVar52 = vfmadd213ps_fma(auVar44,auVar52,auVar107);
        fVar206 = auVar52._0_4_;
        auVar44 = vshufps_avx(auVar52,auVar52,0x55);
        auVar108._0_4_ = auVar41._0_4_ * fVar206 + auVar62._0_4_ * auVar44._0_4_;
        auVar108._4_4_ = auVar41._4_4_ * fVar206 + auVar62._4_4_ * auVar44._4_4_;
        auVar108._8_4_ = auVar41._8_4_ * fVar206 + auVar62._8_4_ * auVar44._8_4_;
        auVar108._12_4_ = auVar41._12_4_ * fVar206 + auVar62._12_4_ * auVar44._12_4_;
        auVar58 = vsubps_avx(auVar58,auVar108);
        auVar44 = vandps_avx512vl(auVar52,auVar238._0_16_);
        auVar52 = vprolq_avx512vl(auVar44,0x20);
        auVar44 = vmaxss_avx(auVar52,auVar44);
        bVar37 = auVar44._0_4_ <= (float)local_358._0_4_;
        if (auVar44._0_4_ < (float)local_358._0_4_) {
          auVar44 = vucomiss_avx512f(auVar48);
          if (bVar37) {
            auVar41 = vucomiss_avx512f(auVar44);
            auVar245 = ZEXT1664(auVar41);
            if (bVar37) {
              vmovshdup_avx(auVar44);
              auVar41 = vucomiss_avx512f(auVar48);
              if (bVar37) {
                auVar51 = vucomiss_avx512f(auVar41);
                auVar245 = ZEXT1664(auVar51);
                if (bVar37) {
                  auVar52 = vinsertps_avx(ZEXT416((uint)(pLVar34->vx).field_0.m128[2]),
                                          ZEXT416(*(uint *)((long)&(pLVar34->vy).field_0 + 8)),0x1c)
                  ;
                  auVar58 = vinsertps_avx(auVar52,ZEXT416(*(uint *)((long)&(pLVar34->vz).field_0 + 8
                                                                   )),0x28);
                  auVar52 = vdpps_avx(auVar58,local_198,0x7f);
                  auVar57 = vdpps_avx(auVar58,local_1a8,0x7f);
                  auVar61 = vdpps_avx(auVar58,local_1b8,0x7f);
                  auVar64 = vdpps_avx(auVar58,local_1c8,0x7f);
                  auVar55 = vdpps_avx(auVar58,local_1d8,0x7f);
                  auVar56 = vdpps_avx(auVar58,local_1e8,0x7f);
                  auVar60 = vdpps_avx(auVar58,local_1f8,0x7f);
                  auVar58 = vdpps_avx(auVar58,local_208,0x7f);
                  auVar59 = vsubss_avx512f(auVar51,auVar41);
                  fVar206 = auVar41._0_4_;
                  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar55._0_4_)),auVar59,auVar52
                                           );
                  auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar206)),auVar59,auVar57
                                           );
                  auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar206)),auVar59,auVar61
                                           );
                  auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar58._0_4_)),auVar59,auVar64
                                           );
                  auVar51 = vsubss_avx512f(auVar51,auVar44);
                  auVar157._0_4_ = auVar51._0_4_;
                  fVar206 = auVar157._0_4_ * auVar157._0_4_ * auVar157._0_4_;
                  local_d8 = auVar44._0_4_;
                  fVar101 = local_d8 * 3.0 * auVar157._0_4_ * auVar157._0_4_;
                  fVar200 = auVar157._0_4_ * local_d8 * local_d8 * 3.0;
                  fVar202 = local_d8 * local_d8 * local_d8;
                  auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar61._0_4_)),
                                            ZEXT416((uint)fVar200),auVar57);
                  auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)fVar101),auVar52);
                  vfmadd231ss_fma(auVar51,ZEXT416((uint)fVar206),auVar41);
                  auVar41 = vucomiss_avx512f(ZEXT416(uVar33));
                  if (bVar37) {
                    fVar204 = *(float *)(ray + k * 4 + 0x80);
                    if (auVar41._0_4_ <= fVar204) {
                      local_c8 = vshufps_avx(auVar44,auVar44,0x55);
                      auVar52 = vsubps_avx512vl(auVar45,local_c8);
                      fVar205 = local_c8._0_4_;
                      auVar179._0_4_ = fVar205 * (float)local_228._0_4_;
                      fVar189 = local_c8._4_4_;
                      auVar179._4_4_ = fVar189 * (float)local_228._4_4_;
                      fVar203 = local_c8._8_4_;
                      auVar179._8_4_ = fVar203 * fStack_220;
                      fVar207 = local_c8._12_4_;
                      auVar179._12_4_ = fVar207 * fStack_21c;
                      auVar185._0_4_ = fVar205 * (float)local_278._0_4_;
                      auVar185._4_4_ = fVar189 * (float)local_278._4_4_;
                      auVar185._8_4_ = fVar203 * fStack_270;
                      auVar185._12_4_ = fVar207 * fStack_26c;
                      auVar197._0_4_ = fVar205 * (float)local_288._0_4_;
                      auVar197._4_4_ = fVar189 * (float)local_288._4_4_;
                      auVar197._8_4_ = fVar203 * fStack_280;
                      auVar197._12_4_ = fVar207 * fStack_27c;
                      auVar215._0_4_ = fVar205 * (float)local_248._0_4_;
                      auVar215._4_4_ = fVar189 * (float)local_248._4_4_;
                      auVar215._8_4_ = fVar203 * fStack_240;
                      auVar215._12_4_ = fVar207 * fStack_23c;
                      auVar44 = vfmadd231ps_fma(auVar179,auVar52,local_218);
                      auVar45 = vfmadd231ps_fma(auVar185,auVar52,local_258);
                      auVar51 = vfmadd231ps_fma(auVar197,auVar52,local_268);
                      auVar52 = vfmadd231ps_fma(auVar215,auVar52,local_238);
                      auVar44 = vsubps_avx(auVar45,auVar44);
                      auVar45 = vsubps_avx(auVar51,auVar45);
                      auVar51 = vsubps_avx(auVar52,auVar51);
                      auVar198._0_4_ = auVar45._0_4_ * local_d8;
                      auVar198._4_4_ = auVar45._4_4_ * local_d8;
                      auVar198._8_4_ = auVar45._8_4_ * local_d8;
                      auVar198._12_4_ = auVar45._12_4_ * local_d8;
                      auVar157._4_4_ = auVar157._0_4_;
                      auVar157._8_4_ = auVar157._0_4_;
                      auVar157._12_4_ = auVar157._0_4_;
                      auVar44 = vfmadd231ps_fma(auVar198,auVar157,auVar44);
                      auVar167._0_4_ = auVar51._0_4_ * local_d8;
                      auVar167._4_4_ = auVar51._4_4_ * local_d8;
                      auVar167._8_4_ = auVar51._8_4_ * local_d8;
                      auVar167._12_4_ = auVar51._12_4_ * local_d8;
                      auVar45 = vfmadd231ps_fma(auVar167,auVar157,auVar45);
                      auVar168._0_4_ = auVar45._0_4_ * local_d8;
                      auVar168._4_4_ = auVar45._4_4_ * local_d8;
                      auVar168._8_4_ = auVar45._8_4_ * local_d8;
                      auVar168._12_4_ = auVar45._12_4_ * local_d8;
                      auVar44 = vfmadd231ps_fma(auVar168,auVar157,auVar44);
                      auVar44 = vmulps_avx512vl(auVar44,auVar129);
                      pGVar7 = (context->scene->geometries).items[uVar5].ptr;
                      if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
LAB_01d00ce1:
                        bVar24 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar24 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar152._0_4_ = fVar202 * (float)local_2d8._0_4_;
                        auVar152._4_4_ = fVar202 * (float)local_2d8._4_4_;
                        auVar152._8_4_ = fVar202 * fStack_2d0;
                        auVar152._12_4_ = fVar202 * fStack_2cc;
                        auVar144._4_4_ = fVar200;
                        auVar144._0_4_ = fVar200;
                        auVar144._8_4_ = fVar200;
                        auVar144._12_4_ = fVar200;
                        auVar45 = vfmadd132ps_fma(auVar144,auVar152,local_2c8);
                        auVar126._4_4_ = fVar101;
                        auVar126._0_4_ = fVar101;
                        auVar126._8_4_ = fVar101;
                        auVar126._12_4_ = fVar101;
                        auVar45 = vfmadd132ps_fma(auVar126,auVar45,local_2b8);
                        auVar118._4_4_ = fVar206;
                        auVar118._0_4_ = fVar206;
                        auVar118._8_4_ = fVar206;
                        auVar118._12_4_ = fVar206;
                        auVar51 = vfmadd132ps_fma(auVar118,auVar45,local_2a8);
                        auVar45 = vshufps_avx(auVar51,auVar51,0xc9);
                        auVar83._16_16_ = vshufps_avx(auVar44,auVar44,0xc9);
                        auVar119._0_4_ = auVar51._0_4_ * auVar83._16_4_;
                        auVar119._4_4_ = auVar51._4_4_ * auVar83._20_4_;
                        auVar119._8_4_ = auVar51._8_4_ * auVar83._24_4_;
                        auVar119._12_4_ = auVar51._12_4_ * auVar83._28_4_;
                        auVar45 = vfmsub231ps_fma(auVar119,auVar44,auVar45);
                        auVar44 = vshufps_avx(auVar45,auVar45,0x55);
                        local_f8 = vshufps_avx(auVar45,auVar45,0xaa);
                        local_e8 = auVar45._0_4_;
                        local_108[0] = (RTCHitN)auVar44[0];
                        local_108[1] = (RTCHitN)auVar44[1];
                        local_108[2] = (RTCHitN)auVar44[2];
                        local_108[3] = (RTCHitN)auVar44[3];
                        local_108[4] = (RTCHitN)auVar44[4];
                        local_108[5] = (RTCHitN)auVar44[5];
                        local_108[6] = (RTCHitN)auVar44[6];
                        local_108[7] = (RTCHitN)auVar44[7];
                        local_108[8] = (RTCHitN)auVar44[8];
                        local_108[9] = (RTCHitN)auVar44[9];
                        local_108[10] = (RTCHitN)auVar44[10];
                        local_108[0xb] = (RTCHitN)auVar44[0xb];
                        local_108[0xc] = (RTCHitN)auVar44[0xc];
                        local_108[0xd] = (RTCHitN)auVar44[0xd];
                        local_108[0xe] = (RTCHitN)auVar44[0xe];
                        local_108[0xf] = (RTCHitN)auVar44[0xf];
                        uStack_e4 = local_e8;
                        uStack_e0 = local_e8;
                        uStack_dc = local_e8;
                        fStack_d4 = local_d8;
                        fStack_d0 = local_d8;
                        fStack_cc = local_d8;
                        local_b8 = local_298._0_8_;
                        uStack_b0 = local_298._8_8_;
                        local_a8 = local_2e8;
                        vpcmpeqd_avx2(ZEXT1632(local_2e8),ZEXT1632(local_2e8));
                        uStack_94 = context->user->instID[0];
                        local_98 = uStack_94;
                        uStack_90 = uStack_94;
                        uStack_8c = uStack_94;
                        uStack_88 = context->user->instPrimID[0];
                        uStack_84 = uStack_88;
                        uStack_80 = uStack_88;
                        uStack_7c = uStack_88;
                        *(float *)(ray + k * 4 + 0x80) = auVar41._0_4_;
                        local_378 = local_2f8;
                        local_328.valid = (int *)local_378;
                        local_328.geometryUserPtr = pGVar7->userPtr;
                        local_328.context = context->user;
                        local_328.ray = (RTCRayN *)ray;
                        local_328.hit = local_108;
                        local_328.N = 4;
                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          local_368 = context;
                          (*pGVar7->occlusionFilterN)(&local_328);
                          auVar245 = ZEXT464(0x3f800000);
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar241 = ZEXT1664(auVar44);
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar239 = ZEXT1664(auVar44);
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar236 = ZEXT1664(auVar44);
                          context = local_368;
                        }
                        uVar39 = vptestmd_avx512vl(local_378,local_378);
                        auVar83._16_16_ = DAT_01feed20._16_16_;
                        if ((uVar39 & 0xf) == 0) {
                          auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar243 = ZEXT3264(auVar70);
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar238 = ZEXT1664(auVar44);
                          auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar237 = ZEXT3264(auVar70);
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar240 = ZEXT1664(auVar44);
                          auVar242 = ZEXT3264(_DAT_01feed20);
                          auVar44 = vxorps_avx512vl(auVar48,auVar48);
                          auVar244 = ZEXT1664(auVar44);
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if (p_Var10 == (RTCFilterFunctionN)0x0) {
                            auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
                            auVar243 = ZEXT3264(auVar70);
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar238 = ZEXT1664(auVar44);
                            auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar237 = ZEXT3264(auVar70);
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar240 = ZEXT1664(auVar44);
                            auVar242 = ZEXT3264(_DAT_01feed20);
                            auVar44 = vxorps_avx512vl(auVar48,auVar48);
                            auVar244 = ZEXT1664(auVar44);
                          }
                          else {
                            auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
                            auVar243 = ZEXT3264(auVar70);
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar238 = ZEXT1664(auVar44);
                            auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar237 = ZEXT3264(auVar70);
                            auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar240 = ZEXT1664(auVar44);
                            auVar242 = ZEXT3264(_DAT_01feed20);
                            auVar44 = vxorps_avx512vl(auVar48,auVar48);
                            auVar244 = ZEXT1664(auVar44);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var10)(&local_328);
                              auVar44 = vxorps_avx512vl(auVar44,auVar44);
                              auVar244 = ZEXT1664(auVar44);
                              auVar245 = ZEXT464(0x3f800000);
                              auVar242 = ZEXT3264(_DAT_01feed20);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar241 = ZEXT1664(auVar44);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar240 = ZEXT1664(auVar44);
                              auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar237 = ZEXT3264(auVar70);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar239 = ZEXT1664(auVar44);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar238 = ZEXT1664(auVar44);
                              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar236 = ZEXT1664(auVar44);
                              auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
                              auVar83._16_16_ = auVar70._16_16_;
                              auVar243 = ZEXT3264(auVar70);
                            }
                          }
                          uVar39 = vptestmd_avx512vl(local_378,local_378);
                          uVar39 = uVar39 & 0xf;
                          auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar37 = (bool)((byte)uVar39 & 1);
                          bVar38 = (bool)((byte)(uVar39 >> 1) & 1);
                          bVar35 = (bool)((byte)(uVar39 >> 2) & 1);
                          bVar36 = SUB81(uVar39 >> 3,0);
                          *(uint *)(local_328.ray + 0x80) =
                               (uint)bVar37 * auVar44._0_4_ |
                               (uint)!bVar37 * *(int *)(local_328.ray + 0x80);
                          *(uint *)(local_328.ray + 0x84) =
                               (uint)bVar38 * auVar44._4_4_ |
                               (uint)!bVar38 * *(int *)(local_328.ray + 0x84);
                          *(uint *)(local_328.ray + 0x88) =
                               (uint)bVar35 * auVar44._8_4_ |
                               (uint)!bVar35 * *(int *)(local_328.ray + 0x88);
                          *(uint *)(local_328.ray + 0x8c) =
                               (uint)bVar36 * auVar44._12_4_ |
                               (uint)!bVar36 * *(int *)(local_328.ray + 0x8c);
                          bVar24 = 1;
                          if ((byte)uVar39 != 0) goto LAB_01d00ce3;
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar204;
                        goto LAB_01d00ce1;
                      }
LAB_01d00ce3:
                      bVar32 = (bool)(bVar32 | bVar24);
                      pLVar34 = local_360;
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
      goto LAB_01cffd8f;
    }
    auVar48 = vinsertps_avx(auVar114,auVar53,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }